

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  anon_struct_96_18_0d0905d3 *paVar1;
  byte bVar2;
  uchar uVar3;
  short sVar4;
  stbi_uc asVar5 [4];
  stbi_uc asVar6 [4];
  undefined8 uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  byte bVar29;
  short sVar30;
  bool bVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined4 z;
  undefined4 z_00;
  stbi_uc sVar38;
  byte bVar39;
  int iVar40;
  stbi__uint32 sVar41;
  int iVar42;
  uint uVar43;
  stbi__jpeg *psVar44;
  char *pcVar45;
  stbi_uc *psVar46;
  float *data_00;
  void *pvVar47;
  code *pcVar48;
  stbi__context *psVar49;
  uchar *data_01;
  uchar *puVar50;
  short sVar51;
  long lVar52;
  long lVar53;
  byte *pbVar54;
  int extraout_EDX;
  uint uVar55;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  ulong extraout_RDX_07;
  ulong extraout_RDX_08;
  ulong extraout_RDX_09;
  ulong extraout_RDX_10;
  stbi_uc *extraout_RDX_11;
  stbi_uc *psVar56;
  stbi_uc *extraout_RDX_12;
  stbi_uc *extraout_RDX_13;
  int iVar57;
  ulong uVar58;
  stbi_uc *psVar59;
  byte *pbVar60;
  int iVar61;
  uint uVar62;
  ulong uVar63;
  int iVar64;
  stbi__uint32 sVar65;
  anon_struct_96_18_0d0905d3 *paVar66;
  ulong uVar67;
  undefined4 in_register_00000084;
  stbi__result_info *ri_00;
  int iVar68;
  stbi__uint32 sVar69;
  int iVar70;
  stbi__context *psVar71;
  short *psVar72;
  int *piVar73;
  uint uVar74;
  ulong uVar75;
  ulong uVar76;
  stbi_uc (*pasVar77) [4];
  long in_FS_OFFSET;
  bool bVar78;
  undefined1 auVar79 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  stbi_uc *coutput [4];
  short data [64];
  ulong local_8990;
  uint local_8968;
  uint local_894c;
  uint local_8938;
  uint local_890c;
  undefined1 local_8908 [12];
  uint uStack_88fc;
  undefined1 local_88f8 [16];
  int local_88e8;
  stbi__uint16 *local_88d8;
  stbi__jpeg *local_88d0;
  undefined4 local_88c8;
  int local_88c4;
  anon_struct_96_18_0d0905d3 *local_88c0;
  ulong local_88b8;
  uint local_88ac;
  stbi__gif local_88a8;
  
  psVar56 = (stbi_uc *)CONCAT44(in_register_00000084,req_comp);
  ri->bits_per_channel = 8;
  ri->num_channels = 0;
  ri->channel_order = 0;
  ri_00 = ri;
  psVar44 = (stbi__jpeg *)malloc(0x4888);
  psVar44->s = s;
  psVar44->idct_block_kernel = stbi__idct_simd;
  psVar44->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
  psVar44->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
  psVar44->jfif = 0;
  psVar44->app14_color_transform = -1;
  psVar44->marker = 0xff;
  sVar38 = stbi__get_marker(psVar44);
  if (sVar38 != 0xd8) {
    *(char **)(in_FS_OFFSET + -0x10) = "no SOI";
  }
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  free(psVar44);
  if (sVar38 == 0xd8) {
    psVar44 = (stbi__jpeg *)malloc(0x4888);
    psVar44->s = s;
    psVar44->idct_block_kernel = stbi__idct_simd;
    psVar44->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
    psVar44->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
    s->img_n = 0;
    if ((uint)req_comp < 5) {
      psVar44->img_comp[0].raw_data = (void *)0x0;
      psVar44->img_comp[0].raw_coeff = (void *)0x0;
      psVar44->img_comp[1].raw_data = (void *)0x0;
      psVar44->img_comp[1].raw_coeff = (void *)0x0;
      psVar44->img_comp[2].raw_data = (void *)0x0;
      psVar44->img_comp[2].raw_coeff = (void *)0x0;
      psVar44->img_comp[3].raw_data = (void *)0x0;
      psVar44->img_comp[3].raw_coeff = (void *)0x0;
      psVar44->restart_interval = 0;
      iVar40 = stbi__decode_jpeg_header(psVar44,0);
      uVar58 = extraout_RDX;
      if (iVar40 != 0) {
        paVar1 = psVar44->img_comp;
        bVar39 = stbi__get_marker(psVar44);
LAB_001322f2:
        if (bVar39 == 0xda) {
          iVar40 = stbi__get16be(psVar44->s);
          psVar49 = psVar44->s;
          pbVar60 = psVar49->img_buffer;
          uVar58 = extraout_RDX_02;
          if (psVar49->img_buffer_end <= pbVar60) {
            if (psVar49->read_from_callbacks != 0) {
              stbi__refill_buffer(psVar49);
              pbVar60 = psVar49->img_buffer;
              uVar58 = extraout_RDX_03;
              goto LAB_00132393;
            }
            psVar44->scan_n = 0;
LAB_00133c4a:
            pcVar45 = "bad SOS component count";
            goto LAB_00133c51;
          }
LAB_00132393:
          psVar49->img_buffer = pbVar60 + 1;
          bVar39 = *pbVar60;
          psVar44->scan_n = (uint)bVar39;
          if (((byte)(bVar39 - 5) < 0xfc) ||
             (psVar49 = psVar44->s, psVar49->img_n < (int)(uint)bVar39)) goto LAB_00133c4a;
          if (iVar40 != (uint)bVar39 * 2 + 6) {
            pcVar45 = "bad SOS len";
            goto LAB_00133c51;
          }
          lVar53 = 0;
          psVar71 = psVar49;
          do {
            pbVar54 = psVar71->img_buffer;
            pbVar60 = psVar71->img_buffer_end;
            if (pbVar54 < pbVar60) {
LAB_00132408:
              psVar71->img_buffer = pbVar54 + 1;
              uVar74 = (uint)*pbVar54;
              pbVar54 = psVar49->img_buffer;
              pbVar60 = psVar49->img_buffer_end;
              psVar71 = psVar49;
            }
            else {
              if (psVar71->read_from_callbacks != 0) {
                stbi__refill_buffer(psVar71);
                pbVar54 = psVar71->img_buffer;
                psVar49 = psVar44->s;
                goto LAB_00132408;
              }
              uVar74 = 0;
            }
            if (pbVar54 < pbVar60) {
LAB_0013244a:
              psVar71->img_buffer = pbVar54 + 1;
              bVar39 = *pbVar54;
              psVar71 = psVar49;
            }
            else {
              if (psVar71->read_from_callbacks != 0) {
                stbi__refill_buffer(psVar71);
                pbVar54 = psVar71->img_buffer;
                psVar49 = psVar44->s;
                goto LAB_0013244a;
              }
              bVar39 = 0;
            }
            iVar40 = psVar71->img_n;
            if ((long)iVar40 < 1) {
              uVar58 = 0;
            }
            else {
              uVar58 = 0;
              paVar66 = paVar1;
              while (paVar66->id != uVar74) {
                uVar58 = uVar58 + 1;
                paVar66 = paVar66 + 1;
                if ((long)iVar40 == uVar58) goto LAB_00133c5a;
              }
            }
            if ((int)uVar58 == iVar40) goto LAB_00133c5a;
            psVar44->img_comp[uVar58 & 0xffffffff].hd = (uint)(bVar39 >> 4);
            if (0x3f < bVar39) {
              pcVar45 = "bad DC huff";
              goto LAB_00133c51;
            }
            paVar1[uVar58 & 0xffffffff].ha = bVar39 & 0xf;
            if (3 < (bVar39 & 0xf)) {
              pcVar45 = "bad AC huff";
              goto LAB_00133c51;
            }
            psVar44->order[lVar53] = (int)uVar58;
            lVar53 = lVar53 + 1;
          } while (lVar53 < psVar44->scan_n);
          pbVar54 = psVar71->img_buffer;
          pbVar60 = psVar71->img_buffer_end;
          if (pbVar54 < pbVar60) {
LAB_0013251a:
            psVar71->img_buffer = pbVar54 + 1;
            uVar74 = (uint)*pbVar54;
            pbVar54 = psVar49->img_buffer;
            pbVar60 = psVar49->img_buffer_end;
            psVar71 = psVar49;
          }
          else {
            if (psVar71->read_from_callbacks != 0) {
              stbi__refill_buffer(psVar71);
              pbVar54 = psVar71->img_buffer;
              psVar49 = psVar44->s;
              goto LAB_0013251a;
            }
            uVar74 = 0;
          }
          psVar44->spec_start = uVar74;
          if (pbVar54 < pbVar60) {
LAB_00132564:
            psVar71->img_buffer = pbVar54 + 1;
            uVar74 = (uint)*pbVar54;
            pbVar54 = psVar49->img_buffer;
            pbVar60 = psVar49->img_buffer_end;
            psVar71 = psVar49;
          }
          else {
            if (psVar71->read_from_callbacks != 0) {
              stbi__refill_buffer(psVar71);
              pbVar54 = psVar71->img_buffer;
              psVar49 = psVar44->s;
              goto LAB_00132564;
            }
            uVar74 = 0;
          }
          psVar44->spec_end = uVar74;
          if (pbVar54 < pbVar60) {
LAB_001325aa:
            psVar71->img_buffer = pbVar54 + 1;
            uVar74 = (uint)*pbVar54;
          }
          else {
            if (psVar71->read_from_callbacks != 0) {
              stbi__refill_buffer(psVar71);
              pbVar54 = psVar71->img_buffer;
              goto LAB_001325aa;
            }
            uVar74 = 0;
          }
          psVar44->succ_high = uVar74 >> 4;
          uVar43 = uVar74 & 0xf;
          uVar58 = (ulong)uVar43;
          psVar44->succ_low = uVar43;
          iVar40 = psVar44->progressive;
          iVar70 = psVar44->spec_start;
          if (iVar40 == 0) {
            if (iVar70 != 0 || uVar74 != 0) {
LAB_0013477e:
              pcVar45 = "bad SOS";
              goto LAB_00133c51;
            }
            psVar44->spec_end = 0x3f;
          }
          else if ((((0x3f < iVar70) || (0x3f < psVar44->spec_end)) || (psVar44->spec_end < iVar70))
                  || ((0xdf < uVar74 || (0xd < uVar43)))) goto LAB_0013477e;
          uVar74 = psVar44->scan_n;
          uVar58 = (ulong)uVar74;
          iVar70 = psVar44->restart_interval;
          if (iVar70 == 0) {
            iVar70 = 0x7fffffff;
          }
          psVar44->code_buffer = 0;
          psVar44->code_bits = 0;
          psVar44->nomore = 0;
          psVar44->img_comp[3].dc_pred = 0;
          psVar44->img_comp[2].dc_pred = 0;
          psVar44->img_comp[1].dc_pred = 0;
          psVar44->img_comp[0].dc_pred = 0;
          psVar44->marker = 0xff;
          psVar44->todo = iVar70;
          psVar44->eob_run = 0;
          if (iVar40 == 0) {
            if (uVar74 == 1) {
              iVar40 = psVar44->order[0];
              iVar70 = psVar44->img_comp[iVar40].y + 7 >> 3;
              bVar78 = true;
              if (0 < iVar70) {
                uVar74 = paVar1[iVar40].x + 7 >> 3;
                iVar64 = 0;
                iVar68 = 0;
                do {
                  if (0 < (int)uVar74) {
                    lVar53 = 0;
                    do {
                      iVar57 = stbi__jpeg_decode_block
                                         (psVar44,(short *)&local_88a8,
                                          (stbi__huffman *)psVar44->huff_dc[paVar1[iVar40].hd].fast,
                                          (stbi__huffman *)psVar44->huff_ac[paVar1[iVar40].ha].fast,
                                          psVar44->fast_ac[paVar1[iVar40].ha],iVar40,
                                          psVar44->dequant[paVar1[iVar40].tq]);
                      uVar75 = extraout_RDX_05;
                      if (iVar57 == 0) goto LAB_001334fa;
                      (*psVar44->idct_block_kernel)
                                (paVar1[iVar40].data + lVar53 + iVar64 * paVar1[iVar40].w2,
                                 paVar1[iVar40].w2,(short *)&local_88a8);
                      iVar57 = psVar44->todo;
                      psVar44->todo = iVar57 + -1;
                      uVar58 = extraout_RDX_06;
                      if (iVar57 < 2) {
                        if (psVar44->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(psVar44);
                          uVar58 = extraout_RDX_07;
                        }
                        if ((psVar44->marker & 0xf8) != 0xd0) goto LAB_001334f3;
                        psVar44->code_buffer = 0;
                        psVar44->code_bits = 0;
                        psVar44->nomore = 0;
                        psVar44->img_comp[3].dc_pred = 0;
                        psVar44->img_comp[2].dc_pred = 0;
                        psVar44->img_comp[1].dc_pred = 0;
                        psVar44->img_comp[0].dc_pred = 0;
                        psVar44->marker = 0xff;
                        iVar57 = psVar44->restart_interval;
                        uVar58 = 0x7fffffff;
                        if (iVar57 == 0) {
                          iVar57 = 0x7fffffff;
                        }
                        psVar44->todo = iVar57;
                        psVar44->eob_run = 0;
                      }
                      lVar53 = lVar53 + 8;
                    } while ((ulong)uVar74 * 8 != lVar53);
                  }
                  iVar68 = iVar68 + 1;
                  iVar64 = iVar64 + 8;
                } while (iVar68 != iVar70);
LAB_001334f3:
                bVar78 = true;
              }
            }
            else {
              uVar58 = (ulong)(uint)psVar44->img_mcu_y;
              bVar78 = true;
              if (0 < psVar44->img_mcu_y) {
                iVar40 = psVar44->img_mcu_x;
                iVar68 = 0;
                do {
                  if (0 < iVar40) {
                    uVar74 = 0;
                    do {
                      iVar40 = psVar44->scan_n;
                      if (0 < iVar40) {
                        uVar58 = 0;
                        do {
                          iVar70 = psVar44->order[uVar58];
                          iVar64 = psVar44->img_comp[iVar70].v;
                          if (0 < iVar64) {
                            iVar40 = paVar1[iVar70].h;
                            iVar57 = 0;
                            do {
                              if (0 < iVar40) {
                                iVar64 = 0;
                                do {
                                  iVar61 = paVar1[iVar70].v;
                                  iVar42 = stbi__jpeg_decode_block
                                                     (psVar44,(short *)&local_88a8,
                                                      (stbi__huffman *)
                                                      psVar44->huff_dc[paVar1[iVar70].hd].fast,
                                                      (stbi__huffman *)
                                                      psVar44->huff_ac[paVar1[iVar70].ha].fast,
                                                      psVar44->fast_ac[paVar1[iVar70].ha],iVar70,
                                                      psVar44->dequant[paVar1[iVar70].tq]);
                                  uVar75 = extraout_RDX_09;
                                  if (iVar42 == 0) goto LAB_001334fa;
                                  (*psVar44->idct_block_kernel)
                                            (paVar1[iVar70].data +
                                             (long)(int)((iVar40 * uVar74 + iVar64) * 8) +
                                             (long)((iVar61 * iVar68 + iVar57) * paVar1[iVar70].w2 *
                                                   8),paVar1[iVar70].w2,(short *)&local_88a8);
                                  iVar64 = iVar64 + 1;
                                  iVar40 = paVar1[iVar70].h;
                                } while (iVar64 < iVar40);
                                iVar64 = paVar1[iVar70].v;
                              }
                              iVar57 = iVar57 + 1;
                            } while (iVar57 < iVar64);
                            iVar40 = psVar44->scan_n;
                          }
                          uVar58 = uVar58 + 1;
                        } while ((long)uVar58 < (long)iVar40);
                        iVar70 = psVar44->todo;
                      }
                      psVar44->todo = iVar70 + -1;
                      bVar78 = iVar70 < 2;
                      iVar70 = iVar70 + -1;
                      if (bVar78) {
                        if (psVar44->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(psVar44);
                          uVar58 = extraout_RDX_10;
                        }
                        if ((psVar44->marker & 0xf8) != 0xd0) goto LAB_001334f3;
                        psVar44->code_buffer = 0;
                        psVar44->code_bits = 0;
                        psVar44->nomore = 0;
                        psVar44->img_comp[3].dc_pred = 0;
                        psVar44->img_comp[2].dc_pred = 0;
                        psVar44->img_comp[1].dc_pred = 0;
                        psVar44->img_comp[0].dc_pred = 0;
                        psVar44->marker = 0xff;
                        iVar70 = psVar44->restart_interval;
                        if (iVar70 == 0) {
                          iVar70 = 0x7fffffff;
                        }
                        psVar44->todo = iVar70;
                        psVar44->eob_run = 0;
                      }
                      uVar74 = uVar74 + 1;
                      uVar58 = (ulong)uVar74;
                      iVar40 = psVar44->img_mcu_x;
                    } while ((int)uVar74 < iVar40);
                    uVar58 = (ulong)(uint)psVar44->img_mcu_y;
                  }
                  iVar68 = iVar68 + 1;
                } while (iVar68 < (int)uVar58);
                goto LAB_001334f3;
              }
            }
            goto LAB_001334fc;
          }
          if (uVar74 == 1) {
            local_88b8 = (ulong)psVar44->order[0];
            local_88c4 = psVar44->img_comp[local_88b8].y + 7 >> 3;
            if (0 < local_88c4) {
              local_88c0 = paVar1 + local_88b8;
              iVar40 = psVar44->img_comp[local_88b8].x + 7 >> 3;
              local_894c = 0;
              do {
                if (0 < iVar40) {
                  iVar70 = 0;
                  do {
                    psVar72 = local_88c0->coeff +
                              (int)((local_88c0->coeff_w * local_894c + iVar70) * 0x40);
                    uVar75 = (ulong)psVar44->spec_start;
                    local_88d8 = (stbi__uint16 *)CONCAT44(local_88d8._4_4_,iVar70);
                    if (uVar75 == 0) {
                      iVar70 = stbi__jpeg_decode_block_prog_dc
                                         (psVar44,psVar72,
                                          (stbi__huffman *)psVar44->huff_dc[local_88c0->hd].fast,
                                          (int)local_88b8);
                      uVar58 = extraout_RDX_04;
                      if (iVar70 == 0) goto LAB_00133c5a;
                    }
                    else {
                      iVar70 = local_88c0->ha;
                      iVar68 = psVar44->eob_run;
                      bVar39 = (byte)psVar44->succ_low;
                      if (psVar44->succ_high == 0) {
                        if (iVar68 == 0) {
                          uVar58 = (ulong)(uint)psVar44->code_bits;
                          do {
                            if ((int)uVar58 < 0x10) {
                              stbi__grow_buffer_unsafe(psVar44);
                            }
                            uVar74 = psVar44->code_buffer;
                            uVar58 = (ulong)(uVar74 >> 0x17);
                            sVar51 = psVar44->fast_ac[iVar70][uVar58];
                            uVar43 = (uint)sVar51;
                            iVar68 = (int)uVar75;
                            if (sVar51 == 0) {
                              if (psVar44->code_bits < 0x10) {
                                stbi__grow_buffer_unsafe(psVar44);
                                uVar74 = psVar44->code_buffer;
                                uVar58 = (ulong)(uVar74 >> 0x17);
                              }
                              uVar75 = (ulong)psVar44->huff_ac[iVar70].fast[uVar58];
                              if (uVar75 == 0xff) {
                                lVar53 = 0;
                                do {
                                  lVar52 = lVar53;
                                  lVar53 = lVar52 + 1;
                                } while (psVar44->huff_ac[iVar70].maxcode[lVar52 + 10] <=
                                         uVar74 >> 0x10);
                                uVar43 = psVar44->code_bits;
                                uVar58 = (ulong)uVar43;
                                if (lVar53 == 8) goto LAB_0013490e;
                                if ((int)uVar43 < (int)(lVar52 + 10)) goto LAB_00134919;
                                uVar75 = (ulong)(int)((uVar74 >> (0x17U - (char)lVar53 & 0x1f) &
                                                      stbi__bmask[lVar52 + 10]) +
                                                     psVar44->huff_ac[iVar70].delta[lVar52 + 10]);
                                bVar2 = psVar44->huff_ac[iVar70].size[uVar75];
                                if ((uVar74 >> (-bVar2 & 0x1f) & stbi__bmask[bVar2]) !=
                                    (uint)psVar44->huff_ac[iVar70].code[uVar75]) goto LAB_001356a7;
                                uVar43 = (uVar43 - (int)lVar53) - 9;
                                uVar58 = (ulong)uVar43;
                                psVar44->code_bits = uVar43;
                                sVar41 = uVar74 << ((byte)(lVar52 + 10) & 0x1f);
                                psVar44->code_buffer = sVar41;
                              }
                              else {
                                bVar2 = psVar44->huff_ac[iVar70].size[uVar75];
                                uVar43 = psVar44->code_bits - (uint)bVar2;
                                uVar58 = (ulong)uVar43;
                                if (psVar44->code_bits < (int)(uint)bVar2) goto LAB_00134919;
                                sVar41 = uVar74 << (bVar2 & 0x1f);
                                psVar44->code_buffer = sVar41;
                                psVar44->code_bits = uVar43;
                              }
                              bVar2 = psVar44->huff_ac[iVar70].values[uVar75];
                              uVar43 = bVar2 & 0xf;
                              bVar29 = bVar2 >> 4;
                              uVar74 = (uint)bVar29;
                              iVar64 = (int)uVar58;
                              if ((bVar2 & 0xf) == 0) {
                                if (bVar2 < 0xf0) {
                                  iVar68 = 1 << bVar29;
                                  psVar44->eob_run = iVar68;
                                  if (0xf < bVar2) {
                                    if (iVar64 < (int)uVar74) {
                                      stbi__grow_buffer_unsafe(psVar44);
                                      sVar41 = psVar44->code_buffer;
                                      iVar64 = psVar44->code_bits;
                                      iVar68 = psVar44->eob_run;
                                    }
                                    uVar62 = sVar41 << bVar29 | sVar41 >> 0x20 - bVar29;
                                    uVar43 = stbi__bmask[uVar74];
                                    psVar44->code_buffer = ~uVar43 & uVar62;
                                    iVar68 = iVar68 + (uVar62 & uVar43);
                                    psVar44->code_bits = iVar64 - uVar74;
                                  }
                                  goto LAB_00132879;
                                }
                                uVar74 = iVar68 + 0x10;
                              }
                              else {
                                lVar53 = (long)iVar68 + (ulong)uVar74;
                                bVar2 = ""[lVar53];
                                if (iVar64 < (int)uVar43) {
                                  stbi__grow_buffer_unsafe(psVar44);
                                  sVar41 = psVar44->code_buffer;
                                  iVar64 = psVar44->code_bits;
                                }
                                uVar55 = sVar41 << (sbyte)uVar43 | sVar41 >> 0x20 - (sbyte)uVar43;
                                uVar62 = *(uint *)((long)stbi__bmask + (ulong)(uVar43 * 4));
                                psVar44->code_buffer = ~uVar62 & uVar55;
                                uVar58 = (ulong)(iVar64 - uVar43);
                                psVar44->code_bits = iVar64 - uVar43;
                                iVar68 = 0;
                                if (-1 < (int)sVar41) {
                                  iVar68 = *(int *)((long)stbi__jbias + (ulong)(uVar43 * 4));
                                }
                                uVar74 = (int)lVar53 + 1;
                                psVar72[bVar2] =
                                     (short)((uVar55 & uVar62) + iVar68 << (bVar39 & 0x1f));
                              }
                            }
                            else {
                              lVar53 = (long)iVar68 + (ulong)(uVar43 >> 4 & 0xf);
                              psVar44->code_buffer = uVar74 << (sbyte)(uVar43 & 0xf);
                              uVar74 = psVar44->code_bits - (uVar43 & 0xf);
                              uVar58 = (ulong)uVar74;
                              psVar44->code_bits = uVar74;
                              uVar74 = (int)lVar53 + 1;
                              psVar72[""[lVar53]] = (short)((uVar43 >> 8) << (bVar39 & 0x1f));
                            }
                            uVar75 = (ulong)uVar74;
                          } while ((int)uVar74 <= psVar44->spec_end);
                        }
                        else {
LAB_00132879:
                          psVar44->eob_run = iVar68 + -1;
                        }
                      }
                      else if (iVar68 == 0) {
                        iVar68 = 0x10000 << (bVar39 & 0x1f);
                        uVar58 = (ulong)(uint)psVar44->code_bits;
                        do {
                          if ((int)uVar58 < 0x10) {
                            stbi__grow_buffer_unsafe(psVar44);
                          }
                          uVar74 = psVar44->code_buffer;
                          uVar67 = (ulong)psVar44->huff_ac[iVar70].fast[uVar74 >> 0x17];
                          if (uVar67 == 0xff) {
                            lVar53 = 0;
                            do {
                              lVar52 = lVar53;
                              lVar53 = lVar52 + 1;
                            } while (psVar44->huff_ac[iVar70].maxcode[lVar52 + 10] <= uVar74 >> 0x10
                                    );
                            uVar43 = psVar44->code_bits;
                            uVar58 = (ulong)uVar43;
                            if (lVar53 == 8) goto LAB_0013490e;
                            if ((int)uVar43 < (int)(lVar52 + 10)) goto LAB_00134919;
                            uVar67 = (ulong)(int)((uVar74 >> (0x17U - (char)lVar53 & 0x1f) &
                                                  stbi__bmask[lVar52 + 10]) +
                                                 psVar44->huff_ac[iVar70].delta[lVar52 + 10]);
                            bVar2 = psVar44->huff_ac[iVar70].size[uVar67];
                            if ((uVar74 >> (-bVar2 & 0x1f) & stbi__bmask[bVar2]) !=
                                (uint)psVar44->huff_ac[iVar70].code[uVar67]) {
LAB_001356a7:
                              __assert_fail("(((j->code_buffer) >> (32 - h->size[c])) & stbi__bmask[h->size[c]]) == h->code[c]"
                                            ,
                                            "/workspace/llm4binary/github/license_c_cmakelists/yig[P]graphics101-pipeline/src/stb_image.h"
                                            ,0x81a,
                                            "int stbi__jpeg_huff_decode(stbi__jpeg *, stbi__huffman *)"
                                           );
                            }
                            uVar43 = (uVar43 - (int)lVar53) - 9;
                            uVar58 = (ulong)uVar43;
                            psVar44->code_bits = uVar43;
                            sVar41 = uVar74 << ((byte)(lVar52 + 10) & 0x1f);
                            psVar44->code_buffer = sVar41;
                          }
                          else {
                            bVar2 = psVar44->huff_ac[iVar70].size[uVar67];
                            uVar43 = psVar44->code_bits - (uint)bVar2;
                            uVar58 = (ulong)uVar43;
                            if (psVar44->code_bits < (int)(uint)bVar2) goto LAB_00134919;
                            sVar41 = uVar74 << (bVar2 & 0x1f);
                            psVar44->code_buffer = sVar41;
                            psVar44->code_bits = uVar43;
                          }
                          iVar64 = (int)uVar58;
                          bVar2 = psVar44->huff_ac[iVar70].values[uVar67];
                          bVar29 = bVar2 >> 4;
                          uVar74 = (uint)bVar29;
                          uVar67 = (ulong)uVar74;
                          if ((bVar2 & 0xf) == 1) {
                            if (iVar64 < 1) {
                              stbi__grow_buffer_unsafe(psVar44);
                              sVar41 = psVar44->code_buffer;
                              iVar64 = psVar44->code_bits;
                            }
                            sVar65 = sVar41 * 2;
                            psVar44->code_buffer = sVar65;
                            uVar58 = (ulong)(iVar64 - 1U);
                            sVar51 = (short)(((int)~sVar41 >> 0x1f | 1U) << (bVar39 & 0x1f));
                            psVar44->code_bits = iVar64 - 1U;
                          }
                          else {
                            if ((bVar2 & 0xf) != 0) goto LAB_00134919;
                            if (bVar2 < 0xf0) {
                              uVar43 = ~(-1 << bVar29);
                              psVar44->eob_run = uVar43;
                              uVar63 = 0x40;
                              if (0xf < bVar2) {
                                if (iVar64 < (int)uVar74) {
                                  stbi__grow_buffer_unsafe(psVar44);
                                  sVar41 = psVar44->code_buffer;
                                  iVar64 = psVar44->code_bits;
                                  uVar43 = psVar44->eob_run;
                                }
                                uVar55 = sVar41 << bVar29 | sVar41 >> 0x20 - bVar29;
                                uVar62 = stbi__bmask[uVar67];
                                sVar65 = ~uVar62 & uVar55;
                                psVar44->code_buffer = sVar65;
                                uVar58 = (ulong)(iVar64 - uVar74);
                                psVar44->code_bits = iVar64 - uVar74;
                                psVar44->eob_run = (uVar55 & uVar62) + uVar43;
                                sVar51 = 0;
                                uVar67 = uVar63;
                                goto LAB_00132a9c;
                              }
                            }
                            else {
                              uVar63 = 0xf;
                            }
                            sVar51 = 0;
                            uVar67 = uVar63;
                            sVar65 = sVar41;
                          }
LAB_00132a9c:
                          uVar74 = psVar44->spec_end;
                          uVar63 = (ulong)uVar74;
                          if ((int)uVar75 <= (int)uVar74) {
                            uVar76 = (long)(int)uVar75;
                            do {
                              uVar74 = (uint)uVar63;
                              iVar64 = (int)uVar58;
                              bVar2 = ""[uVar76];
                              if (psVar72[bVar2] == 0) {
                                if ((int)uVar67 == 0) {
                                  uVar75 = (ulong)((int)uVar76 + 1);
                                  psVar72[bVar2] = sVar51;
                                  break;
                                }
                                uVar67 = (ulong)((int)uVar67 - 1);
                              }
                              else {
                                if (iVar64 < 1) {
                                  stbi__grow_buffer_unsafe(psVar44);
                                  sVar65 = psVar44->code_buffer;
                                  iVar64 = psVar44->code_bits;
                                }
                                sVar41 = sVar65 * 2;
                                psVar44->code_buffer = sVar41;
                                uVar58 = (ulong)(iVar64 - 1U);
                                psVar44->code_bits = iVar64 - 1U;
                                bVar78 = (int)sVar65 < 0;
                                sVar65 = sVar41;
                                if ((bVar78) &&
                                   (sVar4 = psVar72[bVar2], (iVar68 >> 0x10 & (int)sVar4) == 0)) {
                                  sVar30 = (short)((uint)iVar68 >> 0x10);
                                  if (sVar4 < 1) {
                                    sVar30 = -sVar30;
                                  }
                                  psVar72[bVar2] = sVar4 + sVar30;
                                }
                              }
                              uVar75 = uVar76 + 1;
                              uVar74 = psVar44->spec_end;
                              uVar63 = (ulong)(int)uVar74;
                              bVar78 = (long)uVar76 < (long)uVar63;
                              uVar76 = uVar75;
                            } while (bVar78);
                          }
                        } while ((int)uVar75 <= (int)uVar74);
                      }
                      else {
                        psVar44->eob_run = iVar68 + -1;
                        if (psVar44->spec_start <= psVar44->spec_end) {
                          uVar74 = (0x10000 << (bVar39 & 0x1f)) >> 0x10;
                          do {
                            bVar39 = ""[uVar75];
                            if (psVar72[bVar39] != 0) {
                              iVar70 = psVar44->code_bits;
                              if (iVar70 < 1) {
                                stbi__grow_buffer_unsafe(psVar44);
                                iVar70 = psVar44->code_bits;
                              }
                              sVar41 = psVar44->code_buffer;
                              psVar44->code_buffer = sVar41 * 2;
                              psVar44->code_bits = iVar70 + -1;
                              if (((int)sVar41 < 0) &&
                                 (sVar51 = psVar72[bVar39], (uVar74 & (int)sVar51) == 0)) {
                                uVar43 = -uVar74;
                                if (0 < sVar51) {
                                  uVar43 = uVar74;
                                }
                                psVar72[bVar39] = (short)uVar43 + sVar51;
                              }
                            }
                            bVar78 = (long)uVar75 < (long)psVar44->spec_end;
                            uVar75 = uVar75 + 1;
                          } while (bVar78);
                        }
                      }
                    }
                    iVar70 = psVar44->todo;
                    psVar44->todo = iVar70 + -1;
                    if (iVar70 < 2) {
                      if (psVar44->code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(psVar44);
                      }
                      bVar39 = psVar44->marker;
                      if ((bVar39 & 0xf8) != 0xd0) goto LAB_0013350c;
                      psVar44->code_buffer = 0;
                      psVar44->code_bits = 0;
                      psVar44->nomore = 0;
                      psVar44->img_comp[3].dc_pred = 0;
                      psVar44->img_comp[2].dc_pred = 0;
                      psVar44->img_comp[1].dc_pred = 0;
                      psVar44->img_comp[0].dc_pred = 0;
                      psVar44->marker = 0xff;
                      iVar70 = psVar44->restart_interval;
                      if (iVar70 == 0) {
                        iVar70 = 0x7fffffff;
                      }
                      psVar44->todo = iVar70;
                      psVar44->eob_run = 0;
                    }
                    iVar70 = (int)local_88d8 + 1;
                  } while (iVar70 != iVar40);
                }
                local_894c = local_894c + 1;
              } while (local_894c != local_88c4);
            }
          }
          else {
            iVar40 = psVar44->img_mcu_y;
            if (0 < iVar40) {
              iVar68 = psVar44->img_mcu_x;
              iVar64 = 0;
              do {
                if (0 < iVar68) {
                  iVar40 = 0;
                  do {
                    iVar68 = psVar44->scan_n;
                    if (0 < iVar68) {
                      lVar53 = 0;
                      do {
                        iVar70 = psVar44->order[lVar53];
                        iVar57 = psVar44->img_comp[iVar70].v;
                        if (0 < iVar57) {
                          iVar68 = paVar1[iVar70].h;
                          iVar61 = 0;
                          do {
                            if (0 < iVar68) {
                              iVar57 = 0;
                              do {
                                iVar68 = stbi__jpeg_decode_block_prog_dc
                                                   (psVar44,paVar1[iVar70].coeff +
                                                            (iVar68 * iVar40 + iVar57 +
                                                            (paVar1[iVar70].v * iVar64 + iVar61) *
                                                            paVar1[iVar70].coeff_w) * 0x40,
                                                    (stbi__huffman *)
                                                    psVar44->huff_dc[paVar1[iVar70].hd].fast,iVar70)
                                ;
                                uVar58 = extraout_RDX_08;
                                if (iVar68 == 0) goto LAB_00133c5a;
                                iVar57 = iVar57 + 1;
                                iVar68 = paVar1[iVar70].h;
                              } while (iVar57 < iVar68);
                              iVar57 = paVar1[iVar70].v;
                            }
                            iVar61 = iVar61 + 1;
                          } while (iVar61 < iVar57);
                          iVar68 = psVar44->scan_n;
                        }
                        lVar53 = lVar53 + 1;
                      } while (lVar53 < iVar68);
                      iVar70 = psVar44->todo;
                    }
                    psVar44->todo = iVar70 + -1;
                    bVar78 = iVar70 < 2;
                    iVar70 = iVar70 + -1;
                    if (bVar78) {
                      if (psVar44->code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(psVar44);
                      }
                      bVar39 = psVar44->marker;
                      if ((bVar39 & 0xf8) != 0xd0) goto LAB_0013350c;
                      psVar44->code_buffer = 0;
                      psVar44->code_bits = 0;
                      psVar44->nomore = 0;
                      psVar44->img_comp[3].dc_pred = 0;
                      psVar44->img_comp[2].dc_pred = 0;
                      psVar44->img_comp[1].dc_pred = 0;
                      psVar44->img_comp[0].dc_pred = 0;
                      psVar44->marker = 0xff;
                      iVar70 = psVar44->restart_interval;
                      if (iVar70 == 0) {
                        iVar70 = 0x7fffffff;
                      }
                      psVar44->todo = iVar70;
                      psVar44->eob_run = 0;
                    }
                    iVar40 = iVar40 + 1;
                    iVar68 = psVar44->img_mcu_x;
                  } while (iVar40 < iVar68);
                  iVar40 = psVar44->img_mcu_y;
                }
                iVar64 = iVar64 + 1;
              } while (iVar64 < iVar40);
            }
          }
          goto LAB_00133504;
        }
        uVar74 = (uint)bVar39;
        if (uVar74 == 0xdc) {
          iVar40 = stbi__get16be(psVar44->s);
          sVar41 = stbi__get16be(psVar44->s);
          uVar58 = extraout_RDX_01;
          if (iVar40 == 4) {
            if (sVar41 == psVar44->s->img_y) goto LAB_0013234a;
            pcVar45 = "bad DNL height";
          }
          else {
            pcVar45 = "bad DNL len";
          }
          goto LAB_00133c51;
        }
        if (uVar74 == 0xd9) {
          psVar71 = psVar44->s;
          uVar74 = psVar71->img_n;
          if (psVar44->progressive == 0) goto LAB_00133adb;
          if (0 < (int)uVar74) {
            lVar53 = 0;
            do {
              iVar40 = psVar44->img_comp[lVar53].y + 7 >> 3;
              if (0 < iVar40) {
                uVar74 = paVar1[lVar53].x + 7 >> 3;
                iVar70 = 0;
                do {
                  if (0 < (int)uVar74) {
                    uVar58 = 0;
                    do {
                      psVar72 = paVar1[lVar53].coeff +
                                (paVar1[lVar53].coeff_w * iVar70 + (int)uVar58) * 0x40;
                      iVar68 = paVar1[lVar53].tq;
                      lVar52 = 0;
                      do {
                        psVar72[lVar52] = psVar72[lVar52] * psVar44->dequant[iVar68][lVar52];
                        lVar52 = lVar52 + 1;
                      } while (lVar52 != 0x40);
                      (*psVar44->idct_block_kernel)
                                (paVar1[lVar53].data +
                                 uVar58 * 8 + (long)(iVar70 * 8 * paVar1[lVar53].w2),
                                 paVar1[lVar53].w2,psVar72);
                      uVar58 = uVar58 + 1;
                    } while (uVar58 != uVar74);
                  }
                  iVar70 = iVar70 + 1;
                } while (iVar70 != iVar40);
                psVar71 = psVar44->s;
              }
              lVar53 = lVar53 + 1;
              uVar74 = psVar71->img_n;
            } while (lVar53 < (int)uVar74);
LAB_00133adb:
            uVar43 = (2 < (int)uVar74) + 1 + (uint)(2 < (int)uVar74);
            if (req_comp != 0) {
              uVar43 = req_comp;
            }
            if (uVar74 == 3) {
              bVar78 = true;
              uVar62 = 3;
              if (psVar44->rgb != 3) {
                uVar74 = 3;
                if (psVar44->app14_color_transform != 0) goto LAB_00133dca;
                bVar78 = psVar44->jfif == 0;
              }
            }
            else {
LAB_00133dca:
              uVar62 = uVar74;
              bVar78 = false;
            }
            uVar74 = 1;
            if (bVar78) {
              uVar74 = uVar62;
            }
            if (uVar62 != 3) {
              uVar74 = uVar62;
            }
            if (2 < (int)uVar43) {
              uVar74 = uVar62;
            }
            local_88f8 = (undefined1  [16])0x0;
            _local_8908 = (undefined1  [16])0x0;
            sVar41 = psVar71->img_x;
            if (0 < (int)uVar74) {
              lVar53 = 0;
              while( true ) {
                pvVar47 = malloc((ulong)(sVar41 + 3));
                *(void **)((long)&psVar44->img_comp[0].linebuf + lVar53 * 2) = pvVar47;
                iVar40 = extraout_EDX;
                if (pvVar47 == (void *)0x0) break;
                uVar58 = (long)psVar44->img_h_max /
                         (long)*(int *)((long)&psVar44->img_comp[0].h + lVar53 * 2);
                iVar40 = (int)uVar58;
                *(int *)((long)(local_88a8.pal + -7) + lVar53) = iVar40;
                iVar70 = psVar44->img_v_max / *(int *)((long)&psVar44->img_comp[0].v + lVar53 * 2);
                *(int *)((long)(local_88a8.pal + -6) + lVar53) = iVar70;
                *(int *)((long)(local_88a8.pal + -4) + lVar53) = iVar70 >> 1;
                *(int *)((long)(local_88a8.pal + -5) + lVar53) =
                     (int)((ulong)((sVar41 - 1) + iVar40) / (uVar58 & 0xffffffff));
                *(undefined4 *)((long)(local_88a8.pal + -3) + lVar53) = 0;
                uVar7 = *(undefined8 *)((long)&psVar44->img_comp[0].data + lVar53 * 2);
                *(undefined8 *)((long)(local_88a8.pal + -9) + lVar53) = uVar7;
                *(undefined8 *)((long)(local_88a8.pal + -0xb) + lVar53) = uVar7;
                if (iVar40 == 2) {
                  pcVar48 = stbi__resample_row_h_2;
                  if (iVar70 != 1) {
                    if (iVar70 != 2) goto LAB_00133f0e;
                    pcVar48 = psVar44->resample_row_hv_2_kernel;
                  }
                }
                else if (iVar40 == 1) {
                  pcVar48 = stbi__resample_row_generic;
                  if (iVar70 == 2) {
                    pcVar48 = stbi__resample_row_v_2;
                  }
                  if (iVar70 == 1) {
                    pcVar48 = resample_row_1;
                  }
                }
                else {
LAB_00133f0e:
                  pcVar48 = stbi__resample_row_generic;
                }
                *(code **)((long)&((stbi__gif *)(local_88a8.pal + -0xd))->w + lVar53) = pcVar48;
                lVar53 = lVar53 + 0x30;
                if ((ulong)uVar74 * 0x30 == lVar53) goto LAB_00133f2a;
              }
LAB_00134648:
              stbi__free_jpeg_components(psVar44,uVar62,iVar40);
              pcVar45 = "outofmem";
              goto LAB_001321eb;
            }
LAB_00133f2a:
            sVar65 = psVar71->img_y;
            psVar49 = (stbi__context *)stbi__malloc_mad3(uVar43,sVar41,sVar65,1);
            iVar40 = (int)extraout_RDX_11;
            if (psVar49 == (stbi__context *)0x0) goto LAB_00134648;
            if (sVar65 != 0) {
              paVar1 = psVar44->img_comp;
              local_88d8 = (stbi__uint16 *)((long)&psVar49->img_x + 2);
              iVar70 = 0;
              uVar62 = 0;
              psVar56 = extraout_RDX_11;
              local_88d0 = psVar44;
              do {
                sVar41 = psVar71->img_x;
                if (0 < (int)uVar74) {
                  pasVar77 = (stbi_uc (*) [4])&local_88a8.ratio;
                  uVar58 = 0;
                  piVar73 = &paVar1->y;
                  do {
                    asVar5 = pasVar77[-1];
                    asVar6 = pasVar77[-3];
                    iVar40 = (int)asVar6 >> 1;
                    auVar117 = (**(code **)(pasVar77 + -10))
                                         (*(stbi_uc **)(piVar73 + 10),
                                          *(undefined8 *)
                                           (*pasVar77 +
                                           ((ulong)(iVar40 <= (int)asVar5) << 3 | 0xffffffffffffffe0
                                           )),*(undefined8 *)
                                               (*pasVar77 +
                                               ((ulong)((int)asVar5 < iVar40) << 3 |
                                               0xffffffffffffffe0)),pasVar77[-2],pasVar77[-4]);
                    psVar56 = auVar117._8_8_;
                    *(long *)(local_8908 + uVar58 * 8) = auVar117._0_8_;
                    pasVar77[-1] = (stbi_uc  [4])((int)asVar5 + 1);
                    if ((int)asVar6 <= (int)asVar5 + 1) {
                      pasVar77[-1] = (stbi_uc  [4])0x0;
                      *(stbi_uc **)(pasVar77 + -8) = *(stbi_uc **)(pasVar77 + -6);
                      asVar5 = *pasVar77;
                      *pasVar77 = (stbi_uc  [4])((int)asVar5 + 1);
                      if ((int)asVar5 + 1 < *piVar73) {
                        *(stbi_uc **)(pasVar77 + -6) = *(stbi_uc **)(pasVar77 + -6) + piVar73[1];
                      }
                    }
                    uVar58 = uVar58 + 1;
                    piVar73 = piVar73 + 0x18;
                    pasVar77 = pasVar77 + 0xc;
                  } while (uVar74 != uVar58);
                }
                psVar44 = local_88d0;
                if ((int)uVar43 < 3) {
                  psVar71 = local_88d0->s;
                  if (bVar78) {
                    if (uVar43 == 1) {
                      if (psVar71->img_x != 0) {
                        uVar58 = 0;
                        do {
                          bVar39 = *(byte *)(local_88f8._0_8_ + uVar58);
                          psVar49->buffer_start[uVar58 + sVar41 * iVar70 + -0x38] =
                               (stbi_uc)((uint)bVar39 * 2 + ((uint)bVar39 + (uint)bVar39 * 8) * 3 +
                                         (uint)stack0xffffffffffff7700[uVar58] * 0x96 +
                                         (uint)*(byte *)(local_8908._0_8_ + uVar58) * 0x4d >> 8);
                          uVar58 = uVar58 + 1;
                          psVar56 = (stbi_uc *)local_88f8._0_8_;
                        } while (uVar58 < psVar71->img_x);
                      }
                    }
                    else if (psVar71->img_x != 0) {
                      uVar58 = 0;
                      do {
                        bVar39 = *(byte *)(local_88f8._0_8_ + uVar58);
                        psVar49->buffer_start[uVar58 * 2 + (ulong)(sVar41 * iVar70) + -0x38] =
                             (stbi_uc)((uint)bVar39 * 2 + ((uint)bVar39 + (uint)bVar39 * 8) * 3 +
                                       (uint)stack0xffffffffffff7700[uVar58] * 0x96 +
                                       (uint)*(byte *)(local_8908._0_8_ + uVar58) * 0x4d >> 8);
                        psVar49->buffer_start[uVar58 * 2 + (ulong)(sVar41 * iVar70) + -0x37] = 0xff;
                        uVar58 = uVar58 + 1;
                        psVar56 = (stbi_uc *)local_88f8._0_8_;
                      } while (uVar58 < psVar71->img_x);
                    }
                  }
                  else if (psVar71->img_n == 4) {
                    if (local_88d0->app14_color_transform == 2) {
                      if (psVar71->img_x != 0) {
                        psVar59 = psVar49->buffer_start + ((ulong)(sVar41 * iVar70) - 0x37);
                        psVar56 = (stbi_uc *)0x0;
                        do {
                          iVar40 = (*(byte *)(local_8908._0_8_ + (long)psVar56) ^ 0xff) *
                                   (uint)psVar56[local_88f8._8_8_];
                          psVar59[-1] = (char)((iVar40 + 0x80U >> 8) + iVar40 + 0x80 >> 8);
                          *psVar59 = 0xff;
                          psVar56 = psVar56 + 1;
                          psVar59 = psVar59 + uVar43;
                        } while (psVar56 < (stbi_uc *)(ulong)psVar71->img_x);
                      }
                    }
                    else {
                      if (local_88d0->app14_color_transform != 0) goto LAB_0013438e;
                      if (psVar71->img_x != 0) {
                        psVar59 = psVar49->buffer_start + ((ulong)(sVar41 * iVar70) - 0x37);
                        uVar58 = 0;
                        do {
                          bVar39 = *(byte *)(local_88f8._8_8_ + uVar58);
                          iVar40 = (uint)*(byte *)(local_8908._0_8_ + uVar58) * (uint)bVar39;
                          iVar68 = (uint)stack0xffffffffffff7700[uVar58] * (uint)bVar39;
                          psVar59[-1] = (char)((((uint)*(byte *)(local_88f8._0_8_ + uVar58) *
                                                 (uint)bVar39 + 0x80 >> 8) +
                                                (uint)*(byte *)(local_88f8._0_8_ + uVar58) *
                                                (uint)bVar39 + 0x80 >> 8) * 0x1d +
                                               (iVar68 + (iVar68 + 0x80U >> 8) + 0x80 >> 8) * 0x96 +
                                               (iVar40 + (iVar40 + 0x80U >> 8) + 0x80 >> 8) * 0x4d
                                              >> 8);
                          *psVar59 = 0xff;
                          uVar58 = uVar58 + 1;
                          psVar59 = psVar59 + uVar43;
                          psVar56 = stack0xffffffffffff7700;
                        } while (uVar58 < psVar71->img_x);
                      }
                    }
                  }
                  else {
LAB_0013438e:
                    if (uVar43 == 1) {
                      if (psVar71->img_x != 0) {
                        psVar59 = (stbi_uc *)0x0;
                        do {
                          (psVar49->buffer_start + ((ulong)(sVar41 * iVar70) - 0x38))[(long)psVar59]
                               = *(stbi_uc *)(local_8908._0_8_ + (long)psVar59);
                          psVar59 = psVar59 + 1;
                          psVar56 = (stbi_uc *)(ulong)psVar71->img_x;
                        } while (psVar59 < (stbi_uc *)(ulong)psVar71->img_x);
                      }
                    }
                    else if (psVar71->img_x != 0) {
                      psVar59 = (stbi_uc *)0x0;
                      do {
                        psVar49->buffer_start[(long)psVar59 * 2 + (ulong)(sVar41 * iVar70) + -0x38]
                             = *(stbi_uc *)(local_8908._0_8_ + (long)psVar59);
                        psVar49->buffer_start[(long)psVar59 * 2 + (ulong)(sVar41 * iVar70) + -0x37]
                             = 0xff;
                        psVar59 = psVar59 + 1;
                        psVar56 = (stbi_uc *)(ulong)psVar71->img_x;
                      } while (psVar59 < (stbi_uc *)(ulong)psVar71->img_x);
                    }
                  }
                }
                else {
                  psVar71 = local_88d0->s;
                  if (psVar71->img_n == 3) {
                    if (bVar78) {
                      if (psVar71->img_x != 0) {
                        psVar59 = psVar49->buffer_start + ((ulong)(sVar41 * iVar70) - 0x35);
                        psVar56 = (stbi_uc *)0x0;
                        do {
                          psVar59[-3] = *(stbi_uc *)(local_8908._0_8_ + (long)psVar56);
                          psVar59[-2] = stack0xffffffffffff7700[(long)psVar56];
                          psVar59[-1] = *(stbi_uc *)(local_88f8._0_8_ + (long)psVar56);
                          *psVar59 = 0xff;
                          psVar56 = psVar56 + 1;
                          psVar59 = psVar59 + uVar43;
                        } while (psVar56 < (stbi_uc *)(ulong)psVar71->img_x);
                      }
                    }
                    else {
LAB_00134401:
                      (*local_88d0->YCbCr_to_RGB_kernel)
                                (psVar49->buffer_start + ((ulong)(uVar62 * uVar43 * sVar41) - 0x38),
                                 (stbi_uc *)local_8908._0_8_,stack0xffffffffffff7700,
                                 (stbi_uc *)local_88f8._0_8_,psVar71->img_x,uVar43);
                      psVar71 = psVar44->s;
                      psVar56 = extraout_RDX_12;
                    }
                  }
                  else if (psVar71->img_n == 4) {
                    if (local_88d0->app14_color_transform == 2) {
                      (*local_88d0->YCbCr_to_RGB_kernel)
                                (psVar49->buffer_start + ((ulong)(uVar62 * uVar43 * sVar41) - 0x38),
                                 (stbi_uc *)local_8908._0_8_,stack0xffffffffffff7700,
                                 (stbi_uc *)local_88f8._0_8_,psVar71->img_x,uVar43);
                      psVar71 = psVar44->s;
                      psVar56 = extraout_RDX_13;
                      if (psVar71->img_x != 0) {
                        pbVar60 = (byte *)((ulong)(sVar41 * iVar70) + (long)local_88d8);
                        uVar58 = 0;
                        do {
                          bVar39 = *(byte *)(local_88f8._8_8_ + uVar58);
                          iVar40 = (pbVar60[-2] ^ 0xff) * (uint)bVar39;
                          pbVar60[-2] = (byte)((iVar40 + 0x80U >> 8) + iVar40 + 0x80 >> 8);
                          iVar40 = (pbVar60[-1] ^ 0xff) * (uint)bVar39;
                          pbVar60[-1] = (byte)(iVar40 + (iVar40 + 0x80U >> 8) + 0x80 >> 8);
                          iVar40 = (*pbVar60 ^ 0xff) * (uint)bVar39;
                          uVar55 = iVar40 + 0x80U >> 8;
                          *pbVar60 = (byte)(iVar40 + uVar55 + 0x80 >> 8);
                          uVar58 = uVar58 + 1;
                          pbVar60 = pbVar60 + uVar43;
                          psVar56 = (stbi_uc *)(ulong)uVar55;
                        } while (uVar58 < psVar71->img_x);
                      }
                    }
                    else {
                      if (local_88d0->app14_color_transform != 0) goto LAB_00134401;
                      if (psVar71->img_x != 0) {
                        psVar59 = psVar49->buffer_start + ((ulong)(sVar41 * iVar70) - 0x35);
                        uVar58 = 0;
                        do {
                          bVar39 = *(byte *)(local_88f8._8_8_ + uVar58);
                          iVar40 = (uint)*(byte *)(local_8908._0_8_ + uVar58) * (uint)bVar39;
                          psVar59[-3] = (char)((iVar40 + 0x80U >> 8) + iVar40 + 0x80 >> 8);
                          iVar40 = (uint)stack0xffffffffffff7700[uVar58] * (uint)bVar39;
                          psVar59[-2] = (char)(iVar40 + (iVar40 + 0x80U >> 8) + 0x80 >> 8);
                          psVar59[-1] = (char)((uint)*(byte *)(local_88f8._0_8_ + uVar58) *
                                               (uint)bVar39 +
                                               ((uint)*(byte *)(local_88f8._0_8_ + uVar58) *
                                                (uint)bVar39 + 0x80 >> 8) + 0x80 >> 8);
                          *psVar59 = 0xff;
                          uVar58 = uVar58 + 1;
                          psVar59 = psVar59 + uVar43;
                          psVar56 = (stbi_uc *)local_88f8._0_8_;
                        } while (uVar58 < psVar71->img_x);
                      }
                    }
                  }
                  else if (psVar71->img_x != 0) {
                    psVar59 = psVar49->buffer_start + ((ulong)(sVar41 * iVar70) - 0x35);
                    uVar58 = 0;
                    do {
                      sVar38 = *(stbi_uc *)(local_8908._0_8_ + uVar58);
                      psVar59[-1] = sVar38;
                      psVar59[-2] = sVar38;
                      psVar59[-3] = sVar38;
                      *psVar59 = 0xff;
                      uVar58 = uVar58 + 1;
                      psVar59 = psVar59 + uVar43;
                    } while (uVar58 < psVar71->img_x);
                  }
                }
                iVar40 = (int)psVar56;
                uVar62 = uVar62 + 1;
                iVar70 = iVar70 + uVar43;
              } while (uVar62 < psVar71->img_y);
              uVar62 = psVar71->img_n;
            }
            stbi__free_jpeg_components(psVar44,uVar62,iVar40);
            psVar71 = psVar44->s;
            *x = psVar71->img_x;
            *y = psVar71->img_y;
            if (comp != (int *)0x0) {
              *comp = (uint)(2 < psVar71->img_n) * 2 + 1;
            }
            goto LAB_00133c6f;
          }
          uVar43 = req_comp + (uint)(req_comp == 0);
          goto LAB_00133dca;
        }
        iVar40 = stbi__process_marker(psVar44,uVar74);
        uVar58 = extraout_RDX_00;
        if (iVar40 != 0) goto LAB_0013234a;
      }
LAB_00133c5a:
      stbi__free_jpeg_components(psVar44,psVar44->s->img_n,(int)uVar58);
    }
    else {
      pcVar45 = "bad req_comp";
LAB_001321eb:
      *(char **)(in_FS_OFFSET + -0x10) = pcVar45;
    }
    psVar49 = (stbi__context *)0x0;
LAB_00133c6f:
    free(psVar44);
  }
  else {
    iVar40 = stbi__check_png_header(s);
    psVar59 = s->img_buffer_original;
    s->img_buffer = psVar59;
    s->img_buffer_end = s->img_buffer_original_end;
    if (iVar40 == 0) {
      if (psVar59 < s->img_buffer_original_end) {
LAB_001335ee:
        psVar46 = psVar59 + 1;
        s->img_buffer = psVar46;
        if (*psVar59 != 'B') goto LAB_0013370d;
        if (s->img_buffer_end <= psVar46) {
          if (s->read_from_callbacks == 0) goto LAB_0013370d;
          stbi__refill_buffer(s);
          psVar46 = s->img_buffer;
        }
        s->img_buffer = psVar46 + 1;
        if (*psVar46 != 'M') goto LAB_0013370d;
        stbi__get16le(s);
        stbi__get16le(s);
        stbi__get16le(s);
        stbi__get16le(s);
        stbi__get16le(s);
        stbi__get16le(s);
        uVar74 = stbi__get16le(s);
        iVar40 = stbi__get16le(s);
        uVar74 = iVar40 << 0x10 | uVar74;
        if (((0x38 < uVar74) || ((0x100010000001000U >> ((ulong)uVar74 & 0x3f) & 1) == 0)) &&
           (uVar74 != 0x6c)) {
          s->img_buffer = s->img_buffer_original;
          s->img_buffer_end = s->img_buffer_original_end;
          if (uVar74 == 0x7c) goto LAB_001336b7;
          goto LAB_0013371f;
        }
        s->img_buffer = s->img_buffer_original;
        s->img_buffer_end = s->img_buffer_original_end;
LAB_001336b7:
        local_88f8._12_4_ = 0xff;
        pvVar47 = stbi__bmp_parse_header(s,(stbi__bmp_data *)local_8908);
        if (pvVar47 == (void *)0x0) goto LAB_0013224a;
        local_88ac = s->img_y;
        uVar74 = -local_88ac;
        if (0 < (int)local_88ac) {
          uVar74 = local_88ac;
        }
        s->img_y = uVar74;
        if ((uVar74 < 0x1000001) && (uVar43 = s->img_x, uVar43 < 0x1000001)) {
          z = local_88f8._0_4_;
          z_00 = local_88f8._8_4_;
          if (local_8908._8_4_ == 0xc) {
            if (0x17 < (int)local_8908._0_4_) goto LAB_00133cd3;
            uVar62 = ((local_8908._4_4_ - local_88e8) + -0x18) / 3;
LAB_00133ca8:
            local_8990 = (ulong)uVar62;
            if (uVar62 == 0) goto LAB_00133cd3;
            bVar31 = false;
LAB_00134661:
            bVar78 = local_88f8._8_4_ == 0xff000000;
            iVar40 = 4 - (uint)(local_88f8._8_4_ == 0);
            iVar70 = local_8908._0_4_;
          }
          else {
            if ((int)local_8908._0_4_ < 0x10) {
              uVar62 = local_8908._4_4_ - (local_88e8 + local_8908._8_4_) >> 2;
              goto LAB_00133ca8;
            }
LAB_00133cd3:
            if (local_8908._4_4_ !=
                ((int)s->img_buffer - *(int *)&s->img_buffer_original) + s->callback_already_read) {
              __assert_fail("info.offset == s->callback_already_read + (int) (s->img_buffer - s->img_buffer_original)"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/yig[P]graphics101-pipeline/src/stb_image.h"
                            ,0x1515,
                            "void *stbi__bmp_load(stbi__context *, int *, int *, int *, int, stbi__result_info *)"
                           );
            }
            if (s->img_buffer + ((long)s->callback_already_read - (long)s) + -0x38 !=
                (stbi_uc *)(long)(int)local_8908._4_4_) {
              pcVar45 = "bad offset";
              goto LAB_00132241;
            }
            local_8990 = 0;
            bVar78 = true;
            bVar31 = true;
            if (local_8908._0_4_ != 0x18 || local_88f8._8_4_ != 0xff000000) goto LAB_00134661;
            iVar40 = 3;
            iVar70 = 0x18;
            bVar31 = true;
          }
          local_88d0 = (stbi__jpeg *)CONCAT44(local_88d0._4_4_,local_88f8._4_4_);
          local_8968 = local_88f8._12_4_;
          s->img_n = iVar40;
          if (2 < req_comp) {
            iVar40 = req_comp;
          }
          iVar68 = stbi__mad3sizes_valid(iVar40,uVar43,uVar74,0);
          if (iVar68 == 0) goto LAB_00133701;
          data_01 = (uchar *)stbi__malloc_mad3(iVar40,uVar43,uVar74,0);
          if (data_01 == (uchar *)0x0) {
            pcVar45 = "outofmem";
          }
          else if (iVar70 < 0x10) {
            iVar68 = (int)local_8990;
            if (!bVar31 && iVar68 < 0x101) {
              if (0 < iVar68) {
                psVar59 = s->img_buffer;
                uVar58 = 0;
                psVar56 = psVar59;
                do {
                  psVar46 = s->img_buffer_end;
                  if (psVar59 < psVar46) {
LAB_001347d5:
                    psVar56 = psVar59 + 1;
                    s->img_buffer = psVar56;
                    sVar38 = *psVar59;
                    psVar59 = psVar56;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      stbi__refill_buffer(s);
                      psVar59 = s->img_buffer;
                      psVar46 = s->img_buffer_end;
                      goto LAB_001347d5;
                    }
                    sVar38 = '\0';
                  }
                  local_88a8.pal[uVar58 - 0xd][2] = sVar38;
                  if (psVar59 < psVar46) {
LAB_00134814:
                    psVar56 = psVar59 + 1;
                    s->img_buffer = psVar56;
                    sVar38 = *psVar59;
                    psVar59 = psVar56;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      stbi__refill_buffer(s);
                      psVar59 = s->img_buffer;
                      psVar46 = s->img_buffer_end;
                      goto LAB_00134814;
                    }
                    sVar38 = '\0';
                  }
                  local_88a8.pal[uVar58 - 0xd][1] = sVar38;
                  if (psVar59 < psVar46) {
LAB_00134848:
                    psVar56 = psVar59 + 1;
                    s->img_buffer = psVar56;
                    sVar38 = *psVar59;
                    psVar59 = psVar56;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      stbi__refill_buffer(s);
                      psVar59 = s->img_buffer;
                      goto LAB_00134848;
                    }
                    sVar38 = '\0';
                  }
                  local_88a8.pal[uVar58 - 0xd][0] = sVar38;
                  if (local_8908._8_4_ != 0xc) {
                    if (s->img_buffer_end <= psVar56) {
                      psVar59 = psVar56;
                      if (s->read_from_callbacks == 0) goto LAB_00134893;
                      stbi__refill_buffer(s);
                      psVar56 = s->img_buffer;
                    }
                    psVar59 = psVar56 + 1;
                    s->img_buffer = psVar59;
                    psVar56 = psVar59;
                  }
LAB_00134893:
                  local_88a8.pal[uVar58 - 0xd][3] = 0xff;
                  uVar58 = uVar58 + 1;
                } while (local_8990 != uVar58);
              }
              stbi__skip(s,(iVar68 * (local_8908._8_4_ == 0xc | 0xfffffffc) + local_8908._4_4_) -
                           (local_8908._8_4_ + local_88e8));
              if (iVar70 == 1) {
                sVar41 = s->img_y;
                if (0 < (int)sVar41) {
                  sVar65 = s->img_x;
                  iVar68 = 0;
                  iVar70 = 0;
                  do {
                    pbVar60 = s->img_buffer;
                    if (pbVar60 < s->img_buffer_end) {
LAB_00134f77:
                      s->img_buffer = pbVar60 + 1;
                      uVar74 = (uint)*pbVar60;
                      pbVar60 = pbVar60 + 1;
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        stbi__refill_buffer(s);
                        pbVar60 = s->img_buffer;
                        goto LAB_00134f77;
                      }
                      uVar74 = 0;
                    }
                    sVar41 = s->img_x;
                    if (0 < (int)sVar41) {
                      sVar69 = 0;
                      uVar43 = 7;
                      do {
                        uVar58 = (ulong)((uVar74 >> (uVar43 & 0x1f) & 1) != 0);
                        data_01[iVar68] = local_88a8.pal[uVar58 - 0xd][0];
                        data_01[(long)iVar68 + 1] = local_88a8.pal[uVar58 - 0xd][1];
                        data_01[(long)iVar68 + 2] = local_88a8.pal[uVar58 - 0xd][2];
                        iVar64 = iVar68 + 3;
                        if (iVar40 == 4) {
                          data_01[(long)iVar68 + 3] = 0xff;
                          iVar64 = iVar68 + 4;
                        }
                        iVar68 = iVar64;
                        sVar69 = sVar69 + 1;
                        if (sVar69 == sVar41) break;
                        if ((int)uVar43 < 1) {
                          if (s->img_buffer_end <= pbVar60) {
                            if (s->read_from_callbacks == 0) {
                              uVar74 = 0;
                              uVar43 = 7;
                              goto LAB_00135038;
                            }
                            stbi__refill_buffer(s);
                            pbVar60 = s->img_buffer;
                            sVar41 = s->img_x;
                          }
                          s->img_buffer = pbVar60 + 1;
                          uVar74 = (uint)*pbVar60;
                          uVar43 = 7;
                          pbVar60 = pbVar60 + 1;
                        }
                        else {
                          uVar43 = uVar43 - 1;
                        }
LAB_00135038:
                      } while ((int)sVar69 < (int)sVar41);
                    }
                    stbi__skip(s,-(sVar65 + 7 >> 3) & 3);
                    iVar70 = iVar70 + 1;
                    sVar41 = s->img_y;
                  } while (iVar70 < (int)sVar41);
                }
              }
              else {
                if (iVar70 == 8) {
                  uVar74 = s->img_x;
                }
                else {
                  if (iVar70 != 4) {
                    free(data_01);
                    pcVar45 = "bad bpp";
                    goto LAB_00132241;
                  }
                  uVar74 = s->img_x + 1 >> 1;
                }
                sVar41 = s->img_y;
                if (0 < (int)sVar41) {
                  local_8938 = -uVar74 & 3;
                  uVar58 = 0;
                  iVar68 = 0;
                  do {
                    if (0 < (int)s->img_x) {
                      pbVar60 = s->img_buffer;
                      iVar64 = 0;
                      do {
                        if (pbVar60 < s->img_buffer_end) {
LAB_00134ddd:
                          s->img_buffer = pbVar60 + 1;
                          uVar74 = (uint)*pbVar60;
                          pbVar60 = pbVar60 + 1;
                        }
                        else {
                          if (s->read_from_callbacks != 0) {
                            stbi__refill_buffer(s);
                            pbVar60 = s->img_buffer;
                            goto LAB_00134ddd;
                          }
                          uVar74 = 0;
                        }
                        uVar62 = uVar74 & 0xf;
                        uVar43 = uVar74 >> 4;
                        if (iVar70 != 4) {
                          uVar43 = uVar74;
                        }
                        uVar75 = (ulong)uVar43;
                        if (iVar70 != 4) {
                          uVar62 = 0;
                        }
                        lVar53 = (long)(int)uVar58;
                        uVar67 = lVar53 + 3;
                        data_01[lVar53] = local_88a8.pal[uVar75 - 0xd][0];
                        data_01[lVar53 + 1] = local_88a8.pal[uVar75 - 0xd][1];
                        data_01[lVar53 + 2] = local_88a8.pal[uVar75 - 0xd][2];
                        if (iVar40 == 4) {
                          data_01[lVar53 + 3] = 0xff;
                          uVar67 = (ulong)((int)uVar58 + 4);
                        }
                        if (iVar64 + 1U == s->img_x) {
                          uVar58 = uVar67 & 0xffffffff;
                          break;
                        }
                        if (iVar70 == 8) {
                          if (s->img_buffer_end <= pbVar60) {
                            if (s->read_from_callbacks == 0) {
                              uVar62 = 0;
                              goto LAB_00134ea1;
                            }
                            stbi__refill_buffer(s);
                            pbVar60 = s->img_buffer;
                          }
                          s->img_buffer = pbVar60 + 1;
                          uVar62 = (uint)*pbVar60;
                          pbVar60 = pbVar60 + 1;
                        }
LAB_00134ea1:
                        lVar53 = (long)(int)uVar67;
                        uVar58 = lVar53 + 3;
                        uVar75 = (ulong)uVar62;
                        data_01[lVar53] = local_88a8.pal[uVar75 - 0xd][0];
                        data_01[lVar53 + 1] = local_88a8.pal[uVar75 - 0xd][1];
                        data_01[lVar53 + 2] = local_88a8.pal[uVar75 - 0xd][2];
                        if (iVar40 == 4) {
                          data_01[lVar53 + 3] = 0xff;
                          uVar58 = (ulong)((int)uVar67 + 4);
                        }
                        iVar64 = iVar64 + 2;
                      } while (iVar64 < (int)s->img_x);
                    }
                    stbi__skip(s,local_8938);
                    iVar68 = iVar68 + 1;
                    sVar41 = s->img_y;
                  } while (iVar68 < (int)sVar41);
                }
              }
LAB_00135079:
              auVar37 = _DAT_00163750;
              auVar36 = _DAT_00163740;
              auVar35 = _DAT_00163730;
              auVar34 = _DAT_00163720;
              auVar33 = _DAT_00163710;
              auVar32 = _DAT_00163700;
              auVar117 = _DAT_00158010;
              if (((iVar40 == 4) && (local_8968 == 0)) &&
                 (uVar74 = s->img_x * sVar41 * 4 - 1, -1 < (int)uVar74)) {
                uVar43 = uVar74 >> 2;
                auVar79._4_4_ = 0;
                auVar79._0_4_ = uVar43;
                auVar79._8_4_ = uVar43;
                auVar79._12_4_ = 0;
                puVar50 = data_01 + uVar74;
                uVar58 = 0;
                do {
                  auVar97._8_4_ = (int)uVar58;
                  auVar97._0_8_ = uVar58;
                  auVar97._12_4_ = (int)(uVar58 >> 0x20);
                  auVar99 = auVar79 | auVar117;
                  auVar101 = (auVar97 | auVar37) ^ auVar117;
                  iVar70 = auVar99._0_4_;
                  iVar61 = -(uint)(iVar70 < auVar101._0_4_);
                  iVar68 = auVar99._4_4_;
                  auVar103._4_4_ = -(uint)(iVar68 < auVar101._4_4_);
                  iVar64 = auVar99._8_4_;
                  iVar42 = -(uint)(iVar64 < auVar101._8_4_);
                  iVar57 = auVar99._12_4_;
                  auVar103._12_4_ = -(uint)(iVar57 < auVar101._12_4_);
                  auVar80._4_4_ = iVar61;
                  auVar80._0_4_ = iVar61;
                  auVar80._8_4_ = iVar42;
                  auVar80._12_4_ = iVar42;
                  auVar80 = pshuflw(in_XMM1,auVar80,0xe8);
                  auVar102._4_4_ = -(uint)(auVar101._4_4_ == iVar68);
                  auVar102._12_4_ = -(uint)(auVar101._12_4_ == iVar57);
                  auVar102._0_4_ = auVar102._4_4_;
                  auVar102._8_4_ = auVar102._12_4_;
                  auVar89 = pshuflw(in_XMM2,auVar102,0xe8);
                  auVar103._0_4_ = auVar103._4_4_;
                  auVar103._8_4_ = auVar103._12_4_;
                  auVar101 = pshuflw(auVar80,auVar103,0xe8);
                  auVar99._8_4_ = 0xffffffff;
                  auVar99._0_8_ = 0xffffffffffffffff;
                  auVar99._12_4_ = 0xffffffff;
                  auVar99 = (auVar101 | auVar89 & auVar80) ^ auVar99;
                  auVar99 = packssdw(auVar99,auVar99);
                  if ((auVar99 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *puVar50 = 0xff;
                  }
                  auVar89._4_4_ = iVar61;
                  auVar89._0_4_ = iVar61;
                  auVar89._8_4_ = iVar42;
                  auVar89._12_4_ = iVar42;
                  auVar103 = auVar102 & auVar89 | auVar103;
                  auVar99 = packssdw(auVar103,auVar103);
                  auVar101._8_4_ = 0xffffffff;
                  auVar101._0_8_ = 0xffffffffffffffff;
                  auVar101._12_4_ = 0xffffffff;
                  auVar99 = packssdw(auVar99 ^ auVar101,auVar99 ^ auVar101);
                  auVar99 = packsswb(auVar99,auVar99);
                  if ((auVar99._0_4_ >> 8 & 1) != 0) {
                    puVar50[-4] = 0xff;
                  }
                  auVar99 = (auVar97 | auVar36) ^ auVar117;
                  auVar90._0_4_ = -(uint)(iVar70 < auVar99._0_4_);
                  auVar90._4_4_ = -(uint)(iVar68 < auVar99._4_4_);
                  auVar90._8_4_ = -(uint)(iVar64 < auVar99._8_4_);
                  auVar90._12_4_ = -(uint)(iVar57 < auVar99._12_4_);
                  auVar104._4_4_ = auVar90._0_4_;
                  auVar104._0_4_ = auVar90._0_4_;
                  auVar104._8_4_ = auVar90._8_4_;
                  auVar104._12_4_ = auVar90._8_4_;
                  iVar61 = -(uint)(auVar99._4_4_ == iVar68);
                  iVar42 = -(uint)(auVar99._12_4_ == iVar57);
                  auVar17._4_4_ = iVar61;
                  auVar17._0_4_ = iVar61;
                  auVar17._8_4_ = iVar42;
                  auVar17._12_4_ = iVar42;
                  auVar114._4_4_ = auVar90._4_4_;
                  auVar114._0_4_ = auVar90._4_4_;
                  auVar114._8_4_ = auVar90._12_4_;
                  auVar114._12_4_ = auVar90._12_4_;
                  auVar99 = auVar17 & auVar104 | auVar114;
                  auVar99 = packssdw(auVar99,auVar99);
                  auVar8._8_4_ = 0xffffffff;
                  auVar8._0_8_ = 0xffffffffffffffff;
                  auVar8._12_4_ = 0xffffffff;
                  auVar99 = packssdw(auVar99 ^ auVar8,auVar99 ^ auVar8);
                  auVar99 = packsswb(auVar99,auVar99);
                  if ((auVar99._0_4_ >> 0x10 & 1) != 0) {
                    puVar50[-8] = 0xff;
                  }
                  auVar99 = pshufhw(auVar99,auVar104,0x84);
                  auVar18._4_4_ = iVar61;
                  auVar18._0_4_ = iVar61;
                  auVar18._8_4_ = iVar42;
                  auVar18._12_4_ = iVar42;
                  auVar101 = pshufhw(auVar90,auVar18,0x84);
                  auVar80 = pshufhw(auVar99,auVar114,0x84);
                  auVar81._8_4_ = 0xffffffff;
                  auVar81._0_8_ = 0xffffffffffffffff;
                  auVar81._12_4_ = 0xffffffff;
                  auVar81 = (auVar80 | auVar101 & auVar99) ^ auVar81;
                  auVar99 = packssdw(auVar81,auVar81);
                  auVar99 = packsswb(auVar99,auVar99);
                  if ((auVar99._0_4_ >> 0x18 & 1) != 0) {
                    puVar50[-0xc] = 0xff;
                  }
                  auVar99 = (auVar97 | auVar35) ^ auVar117;
                  auVar91._0_4_ = -(uint)(iVar70 < auVar99._0_4_);
                  auVar91._4_4_ = -(uint)(iVar68 < auVar99._4_4_);
                  auVar91._8_4_ = -(uint)(iVar64 < auVar99._8_4_);
                  auVar91._12_4_ = -(uint)(iVar57 < auVar99._12_4_);
                  auVar19._4_4_ = auVar91._0_4_;
                  auVar19._0_4_ = auVar91._0_4_;
                  auVar19._8_4_ = auVar91._8_4_;
                  auVar19._12_4_ = auVar91._8_4_;
                  auVar101 = pshuflw(auVar114,auVar19,0xe8);
                  auVar82._0_4_ = -(uint)(auVar99._0_4_ == iVar70);
                  auVar82._4_4_ = -(uint)(auVar99._4_4_ == iVar68);
                  auVar82._8_4_ = -(uint)(auVar99._8_4_ == iVar64);
                  auVar82._12_4_ = -(uint)(auVar99._12_4_ == iVar57);
                  auVar105._4_4_ = auVar82._4_4_;
                  auVar105._0_4_ = auVar82._4_4_;
                  auVar105._8_4_ = auVar82._12_4_;
                  auVar105._12_4_ = auVar82._12_4_;
                  auVar99 = pshuflw(auVar82,auVar105,0xe8);
                  auVar106._4_4_ = auVar91._4_4_;
                  auVar106._0_4_ = auVar91._4_4_;
                  auVar106._8_4_ = auVar91._12_4_;
                  auVar106._12_4_ = auVar91._12_4_;
                  auVar80 = pshuflw(auVar91,auVar106,0xe8);
                  auVar9._8_4_ = 0xffffffff;
                  auVar9._0_8_ = 0xffffffffffffffff;
                  auVar9._12_4_ = 0xffffffff;
                  auVar99 = packssdw(auVar99 & auVar101,(auVar80 | auVar99 & auVar101) ^ auVar9);
                  auVar99 = packsswb(auVar99,auVar99);
                  if ((auVar99 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                    puVar50[-0x10] = 0xff;
                  }
                  auVar20._4_4_ = auVar91._0_4_;
                  auVar20._0_4_ = auVar91._0_4_;
                  auVar20._8_4_ = auVar91._8_4_;
                  auVar20._12_4_ = auVar91._8_4_;
                  auVar106 = auVar105 & auVar20 | auVar106;
                  auVar80 = packssdw(auVar106,auVar106);
                  auVar10._8_4_ = 0xffffffff;
                  auVar10._0_8_ = 0xffffffffffffffff;
                  auVar10._12_4_ = 0xffffffff;
                  auVar99 = packssdw(auVar99,auVar80 ^ auVar10);
                  auVar99 = packsswb(auVar99,auVar99);
                  if ((auVar99._4_2_ >> 8 & 1) != 0) {
                    puVar50[-0x14] = 0xff;
                  }
                  auVar99 = (auVar97 | auVar34) ^ auVar117;
                  auVar92._0_4_ = -(uint)(iVar70 < auVar99._0_4_);
                  auVar92._4_4_ = -(uint)(iVar68 < auVar99._4_4_);
                  auVar92._8_4_ = -(uint)(iVar64 < auVar99._8_4_);
                  auVar92._12_4_ = -(uint)(iVar57 < auVar99._12_4_);
                  auVar107._4_4_ = auVar92._0_4_;
                  auVar107._0_4_ = auVar92._0_4_;
                  auVar107._8_4_ = auVar92._8_4_;
                  auVar107._12_4_ = auVar92._8_4_;
                  iVar61 = -(uint)(auVar99._4_4_ == iVar68);
                  iVar42 = -(uint)(auVar99._12_4_ == iVar57);
                  auVar21._4_4_ = iVar61;
                  auVar21._0_4_ = iVar61;
                  auVar21._8_4_ = iVar42;
                  auVar21._12_4_ = iVar42;
                  auVar115._4_4_ = auVar92._4_4_;
                  auVar115._0_4_ = auVar92._4_4_;
                  auVar115._8_4_ = auVar92._12_4_;
                  auVar115._12_4_ = auVar92._12_4_;
                  auVar99 = auVar21 & auVar107 | auVar115;
                  auVar99 = packssdw(auVar99,auVar99);
                  auVar11._8_4_ = 0xffffffff;
                  auVar11._0_8_ = 0xffffffffffffffff;
                  auVar11._12_4_ = 0xffffffff;
                  auVar99 = packssdw(auVar99 ^ auVar11,auVar99 ^ auVar11);
                  auVar99 = packsswb(auVar99,auVar99);
                  if ((auVar99 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                    puVar50[-0x18] = 0xff;
                  }
                  auVar99 = pshufhw(auVar99,auVar107,0x84);
                  auVar22._4_4_ = iVar61;
                  auVar22._0_4_ = iVar61;
                  auVar22._8_4_ = iVar42;
                  auVar22._12_4_ = iVar42;
                  auVar101 = pshufhw(auVar92,auVar22,0x84);
                  auVar80 = pshufhw(auVar99,auVar115,0x84);
                  auVar83._8_4_ = 0xffffffff;
                  auVar83._0_8_ = 0xffffffffffffffff;
                  auVar83._12_4_ = 0xffffffff;
                  auVar83 = (auVar80 | auVar101 & auVar99) ^ auVar83;
                  auVar99 = packssdw(auVar83,auVar83);
                  auVar99 = packsswb(auVar99,auVar99);
                  if ((auVar99._6_2_ >> 8 & 1) != 0) {
                    puVar50[-0x1c] = 0xff;
                  }
                  auVar99 = (auVar97 | auVar33) ^ auVar117;
                  auVar93._0_4_ = -(uint)(iVar70 < auVar99._0_4_);
                  auVar93._4_4_ = -(uint)(iVar68 < auVar99._4_4_);
                  auVar93._8_4_ = -(uint)(iVar64 < auVar99._8_4_);
                  auVar93._12_4_ = -(uint)(iVar57 < auVar99._12_4_);
                  auVar23._4_4_ = auVar93._0_4_;
                  auVar23._0_4_ = auVar93._0_4_;
                  auVar23._8_4_ = auVar93._8_4_;
                  auVar23._12_4_ = auVar93._8_4_;
                  auVar101 = pshuflw(auVar115,auVar23,0xe8);
                  auVar84._0_4_ = -(uint)(auVar99._0_4_ == iVar70);
                  auVar84._4_4_ = -(uint)(auVar99._4_4_ == iVar68);
                  auVar84._8_4_ = -(uint)(auVar99._8_4_ == iVar64);
                  auVar84._12_4_ = -(uint)(auVar99._12_4_ == iVar57);
                  auVar108._4_4_ = auVar84._4_4_;
                  auVar108._0_4_ = auVar84._4_4_;
                  auVar108._8_4_ = auVar84._12_4_;
                  auVar108._12_4_ = auVar84._12_4_;
                  auVar99 = pshuflw(auVar84,auVar108,0xe8);
                  auVar109._4_4_ = auVar93._4_4_;
                  auVar109._0_4_ = auVar93._4_4_;
                  auVar109._8_4_ = auVar93._12_4_;
                  auVar109._12_4_ = auVar93._12_4_;
                  auVar80 = pshuflw(auVar93,auVar109,0xe8);
                  auVar94._8_4_ = 0xffffffff;
                  auVar94._0_8_ = 0xffffffffffffffff;
                  auVar94._12_4_ = 0xffffffff;
                  auVar94 = (auVar80 | auVar99 & auVar101) ^ auVar94;
                  auVar80 = packssdw(auVar94,auVar94);
                  auVar99 = packsswb(auVar99 & auVar101,auVar80);
                  if ((auVar99 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    puVar50[-0x20] = 0xff;
                  }
                  auVar24._4_4_ = auVar93._0_4_;
                  auVar24._0_4_ = auVar93._0_4_;
                  auVar24._8_4_ = auVar93._8_4_;
                  auVar24._12_4_ = auVar93._8_4_;
                  auVar109 = auVar108 & auVar24 | auVar109;
                  auVar80 = packssdw(auVar109,auVar109);
                  auVar12._8_4_ = 0xffffffff;
                  auVar12._0_8_ = 0xffffffffffffffff;
                  auVar12._12_4_ = 0xffffffff;
                  auVar80 = packssdw(auVar80 ^ auVar12,auVar80 ^ auVar12);
                  auVar99 = packsswb(auVar99,auVar80);
                  if ((auVar99._8_2_ >> 8 & 1) != 0) {
                    puVar50[-0x24] = 0xff;
                  }
                  auVar99 = (auVar97 | auVar32) ^ auVar117;
                  auVar95._0_4_ = -(uint)(iVar70 < auVar99._0_4_);
                  auVar95._4_4_ = -(uint)(iVar68 < auVar99._4_4_);
                  auVar95._8_4_ = -(uint)(iVar64 < auVar99._8_4_);
                  auVar95._12_4_ = -(uint)(iVar57 < auVar99._12_4_);
                  auVar110._4_4_ = auVar95._0_4_;
                  auVar110._0_4_ = auVar95._0_4_;
                  auVar110._8_4_ = auVar95._8_4_;
                  auVar110._12_4_ = auVar95._8_4_;
                  iVar61 = -(uint)(auVar99._4_4_ == iVar68);
                  iVar42 = -(uint)(auVar99._12_4_ == iVar57);
                  auVar25._4_4_ = iVar61;
                  auVar25._0_4_ = iVar61;
                  auVar25._8_4_ = iVar42;
                  auVar25._12_4_ = iVar42;
                  auVar116._4_4_ = auVar95._4_4_;
                  auVar116._0_4_ = auVar95._4_4_;
                  auVar116._8_4_ = auVar95._12_4_;
                  auVar116._12_4_ = auVar95._12_4_;
                  auVar99 = auVar25 & auVar110 | auVar116;
                  auVar99 = packssdw(auVar99,auVar99);
                  auVar13._8_4_ = 0xffffffff;
                  auVar13._0_8_ = 0xffffffffffffffff;
                  auVar13._12_4_ = 0xffffffff;
                  auVar99 = packssdw(auVar99 ^ auVar13,auVar99 ^ auVar13);
                  auVar99 = packsswb(auVar99,auVar99);
                  if ((auVar99 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                    puVar50[-0x28] = 0xff;
                  }
                  auVar99 = pshufhw(auVar99,auVar110,0x84);
                  auVar26._4_4_ = iVar61;
                  auVar26._0_4_ = iVar61;
                  auVar26._8_4_ = iVar42;
                  auVar26._12_4_ = iVar42;
                  auVar101 = pshufhw(auVar95,auVar26,0x84);
                  auVar80 = pshufhw(auVar99,auVar116,0x84);
                  auVar85._8_4_ = 0xffffffff;
                  auVar85._0_8_ = 0xffffffffffffffff;
                  auVar85._12_4_ = 0xffffffff;
                  auVar85 = (auVar80 | auVar101 & auVar99) ^ auVar85;
                  auVar99 = packssdw(auVar85,auVar85);
                  auVar99 = packsswb(auVar99,auVar99);
                  if ((auVar99._10_2_ >> 8 & 1) != 0) {
                    puVar50[-0x2c] = 0xff;
                  }
                  auVar99 = (auVar97 | _DAT_001636f0) ^ auVar117;
                  auVar96._0_4_ = -(uint)(iVar70 < auVar99._0_4_);
                  auVar96._4_4_ = -(uint)(iVar68 < auVar99._4_4_);
                  auVar96._8_4_ = -(uint)(iVar64 < auVar99._8_4_);
                  auVar96._12_4_ = -(uint)(iVar57 < auVar99._12_4_);
                  auVar27._4_4_ = auVar96._0_4_;
                  auVar27._0_4_ = auVar96._0_4_;
                  auVar27._8_4_ = auVar96._8_4_;
                  auVar27._12_4_ = auVar96._8_4_;
                  auVar101 = pshuflw(auVar116,auVar27,0xe8);
                  auVar86._0_4_ = -(uint)(auVar99._0_4_ == iVar70);
                  auVar86._4_4_ = -(uint)(auVar99._4_4_ == iVar68);
                  auVar86._8_4_ = -(uint)(auVar99._8_4_ == iVar64);
                  auVar86._12_4_ = -(uint)(auVar99._12_4_ == iVar57);
                  auVar111._4_4_ = auVar86._4_4_;
                  auVar111._0_4_ = auVar86._4_4_;
                  auVar111._8_4_ = auVar86._12_4_;
                  auVar111._12_4_ = auVar86._12_4_;
                  auVar99 = pshuflw(auVar86,auVar111,0xe8);
                  auVar112._4_4_ = auVar96._4_4_;
                  auVar112._0_4_ = auVar96._4_4_;
                  auVar112._8_4_ = auVar96._12_4_;
                  auVar112._12_4_ = auVar96._12_4_;
                  auVar80 = pshuflw(auVar96,auVar112,0xe8);
                  auVar14._8_4_ = 0xffffffff;
                  auVar14._0_8_ = 0xffffffffffffffff;
                  auVar14._12_4_ = 0xffffffff;
                  auVar99 = packssdw(auVar99 & auVar101,(auVar80 | auVar99 & auVar101) ^ auVar14);
                  auVar99 = packsswb(auVar99,auVar99);
                  if ((auVar99 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                    puVar50[-0x30] = 0xff;
                  }
                  auVar28._4_4_ = auVar96._0_4_;
                  auVar28._0_4_ = auVar96._0_4_;
                  auVar28._8_4_ = auVar96._8_4_;
                  auVar28._12_4_ = auVar96._8_4_;
                  auVar112 = auVar111 & auVar28 | auVar112;
                  auVar80 = packssdw(auVar112,auVar112);
                  auVar15._8_4_ = 0xffffffff;
                  auVar15._0_8_ = 0xffffffffffffffff;
                  auVar15._12_4_ = 0xffffffff;
                  auVar99 = packssdw(auVar99,auVar80 ^ auVar15);
                  auVar99 = packsswb(auVar99,auVar99);
                  if ((auVar99._12_2_ >> 8 & 1) != 0) {
                    puVar50[-0x34] = 0xff;
                  }
                  auVar99 = (auVar97 | _DAT_001636e0) ^ auVar117;
                  auVar87._0_4_ = -(uint)(iVar70 < auVar99._0_4_);
                  auVar87._4_4_ = -(uint)(iVar68 < auVar99._4_4_);
                  auVar87._8_4_ = -(uint)(iVar64 < auVar99._8_4_);
                  auVar87._12_4_ = -(uint)(iVar57 < auVar99._12_4_);
                  auVar113._4_4_ = auVar87._0_4_;
                  auVar113._0_4_ = auVar87._0_4_;
                  auVar113._8_4_ = auVar87._8_4_;
                  auVar113._12_4_ = auVar87._8_4_;
                  auVar98._4_4_ = -(uint)(auVar99._4_4_ == iVar68);
                  auVar98._12_4_ = -(uint)(auVar99._12_4_ == iVar57);
                  auVar98._0_4_ = auVar98._4_4_;
                  auVar98._8_4_ = auVar98._12_4_;
                  auVar100._4_4_ = auVar87._4_4_;
                  auVar100._0_4_ = auVar87._4_4_;
                  auVar100._8_4_ = auVar87._12_4_;
                  auVar100._12_4_ = auVar87._12_4_;
                  auVar80 = auVar98 & auVar113 | auVar100;
                  auVar99 = packssdw(auVar87,auVar80);
                  auVar16._8_4_ = 0xffffffff;
                  auVar16._0_8_ = 0xffffffffffffffff;
                  auVar16._12_4_ = 0xffffffff;
                  auVar99 = packssdw(auVar99 ^ auVar16,auVar99 ^ auVar16);
                  auVar99 = packsswb(auVar99,auVar99);
                  if ((auVar99 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                    puVar50[-0x38] = 0xff;
                  }
                  auVar99 = pshufhw(auVar99,auVar113,0x84);
                  in_XMM2 = pshufhw(auVar80,auVar98,0x84);
                  in_XMM2 = in_XMM2 & auVar99;
                  auVar99 = pshufhw(auVar99,auVar100,0x84);
                  auVar88._8_4_ = 0xffffffff;
                  auVar88._0_8_ = 0xffffffffffffffff;
                  auVar88._12_4_ = 0xffffffff;
                  auVar88 = (auVar99 | in_XMM2) ^ auVar88;
                  auVar99 = packssdw(auVar88,auVar88);
                  in_XMM1 = packsswb(auVar99,auVar99);
                  if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
                    puVar50[-0x3c] = 0xff;
                  }
                  uVar58 = uVar58 + 0x10;
                  puVar50 = puVar50 + -0x40;
                } while ((uVar43 + 0x10 & 0x3ffffff0) != uVar58);
              }
              if ((int)local_88ac < 1) {
                uVar74 = s->img_x;
              }
              else {
                uVar74 = s->img_x;
                if (0 < (int)sVar41 >> 1) {
                  uVar43 = uVar74 * iVar40;
                  uVar62 = (sVar41 - 1) * uVar43;
                  uVar58 = 0;
                  uVar75 = 0;
                  do {
                    if (0 < (int)uVar43) {
                      uVar67 = 0;
                      do {
                        uVar3 = data_01[uVar67 + uVar58];
                        data_01[uVar67 + uVar58] = data_01[uVar67 + uVar62];
                        data_01[uVar67 + uVar62] = uVar3;
                        uVar67 = uVar67 + 1;
                      } while (uVar43 != uVar67);
                    }
                    uVar75 = uVar75 + 1;
                    uVar62 = uVar62 - uVar43;
                    uVar58 = (ulong)((int)uVar58 + uVar43);
                  } while (uVar75 != (uint)((int)sVar41 >> 1));
                }
              }
              if ((req_comp == 0) || (iVar40 == req_comp)) {
LAB_00135662:
                *x = uVar74;
                *y = s->img_y;
                if (comp == (int *)0x0) {
                  return data_01;
                }
                *comp = s->img_n;
                return data_01;
              }
              data_01 = stbi__convert_format(data_01,iVar40,req_comp,uVar74,sVar41);
              if (data_01 != (uchar *)0x0) {
                uVar74 = s->img_x;
                goto LAB_00135662;
              }
              goto LAB_0013224a;
            }
            free(data_01);
            pcVar45 = "invalid";
          }
          else {
            stbi__skip(s,local_8908._4_4_ - (local_8908._8_4_ + local_88e8));
            uVar74 = (uint)local_88d0;
            if (iVar70 != 0x10) {
              if (iVar70 == 0x20) {
                local_890c = 0;
                if (!(bool)((uStack_88fc == 0xff0000 && (z == 0xff00 && (uint)local_88d0 == 0xff)) &
                           bVar78)) goto LAB_001349be;
                bVar78 = true;
              }
              else {
                local_890c = 0;
                if (iVar70 != 0x18) goto LAB_001349be;
                local_890c = s->img_x & 3;
                bVar78 = false;
              }
              local_88c8 = 0;
              iVar61 = 0;
              iVar68 = 0;
              iVar64 = 0;
              iVar57 = 0;
              uVar43 = 0;
              local_894c = 0;
              local_88c0 = (anon_struct_96_18_0d0905d3 *)((ulong)local_88c0 & 0xffffffff00000000);
              local_88b8 = local_88b8 & 0xffffffff00000000;
LAB_00134ac4:
              sVar41 = s->img_y;
              if (0 < (int)sVar41) {
                local_88d8 = (stbi__uint16 *)CONCAT44(local_88d8._4_4_,iVar61);
                uVar58 = 0;
                iVar61 = 0;
                do {
                  uVar75 = uVar58;
                  local_88c4 = iVar61;
                  if ((char)local_88c8 == '\0') {
                    if (0 < (int)s->img_x) {
                      pbVar60 = s->img_buffer;
                      iVar61 = 0;
                      do {
                        pbVar54 = s->img_buffer_end;
                        if (pbVar60 < pbVar54) {
LAB_00134c25:
                          s->img_buffer = pbVar60 + 1;
                          bVar39 = *pbVar60;
                          pbVar60 = pbVar60 + 1;
                        }
                        else {
                          if (s->read_from_callbacks != 0) {
                            stbi__refill_buffer(s);
                            pbVar60 = s->img_buffer;
                            pbVar54 = s->img_buffer_end;
                            goto LAB_00134c25;
                          }
                          bVar39 = 0;
                        }
                        lVar53 = (long)(int)uVar58;
                        data_01[lVar53 + 2] = bVar39;
                        if (pbVar60 < pbVar54) {
LAB_00134c68:
                          s->img_buffer = pbVar60 + 1;
                          bVar39 = *pbVar60;
                          pbVar60 = pbVar60 + 1;
                        }
                        else {
                          if (s->read_from_callbacks != 0) {
                            stbi__refill_buffer(s);
                            pbVar60 = s->img_buffer;
                            pbVar54 = s->img_buffer_end;
                            goto LAB_00134c68;
                          }
                          bVar39 = 0;
                        }
                        data_01[lVar53 + 1] = bVar39;
                        if (pbVar60 < pbVar54) {
LAB_00134ca1:
                          s->img_buffer = pbVar60 + 1;
                          bVar39 = *pbVar60;
                          pbVar60 = pbVar60 + 1;
                        }
                        else {
                          if (s->read_from_callbacks != 0) {
                            stbi__refill_buffer(s);
                            pbVar60 = s->img_buffer;
                            goto LAB_00134ca1;
                          }
                          bVar39 = 0;
                        }
                        data_01[lVar53] = bVar39;
                        bVar39 = 0xff;
                        if (bVar78) {
                          if (s->img_buffer_end <= pbVar60) {
                            if (s->read_from_callbacks == 0) {
                              bVar39 = 0;
                              goto LAB_00134cf3;
                            }
                            stbi__refill_buffer(s);
                            pbVar60 = s->img_buffer;
                          }
                          s->img_buffer = pbVar60 + 1;
                          bVar39 = *pbVar60;
                          pbVar60 = pbVar60 + 1;
                        }
LAB_00134cf3:
                        uVar75 = lVar53 + 3;
                        if (iVar40 == 4) {
                          data_01[lVar53 + 3] = bVar39;
                          uVar75 = (ulong)((int)uVar58 + 4);
                        }
                        local_8968 = local_8968 | bVar39;
                        iVar61 = iVar61 + 1;
                        uVar58 = uVar75 & 0xffffffff;
                      } while (iVar61 < (int)s->img_x);
                    }
                  }
                  else if (0 < (int)s->img_x) {
                    iVar61 = 0;
                    do {
                      uVar74 = stbi__get16le(s);
                      if (iVar70 != 0x10) {
                        iVar42 = stbi__get16le(s);
                        uVar74 = uVar74 | iVar42 << 0x10;
                      }
                      iVar42 = stbi__shiftsigned(uVar74 & uStack_88fc,(int)local_88d8,uVar43);
                      lVar53 = (long)(int)uVar58;
                      data_01[lVar53] = (uchar)iVar42;
                      iVar42 = stbi__shiftsigned(uVar74 & z,iVar68,local_894c);
                      data_01[lVar53 + 1] = (uchar)iVar42;
                      iVar42 = stbi__shiftsigned(uVar74 & (uint)local_88d0,iVar64,(int)local_88c0);
                      data_01[lVar53 + 2] = (uchar)iVar42;
                      if (z_00 == 0) {
                        uVar74 = 0xff;
                      }
                      else {
                        uVar74 = stbi__shiftsigned(uVar74 & z_00,iVar57,(int)local_88b8);
                      }
                      uVar75 = lVar53 + 3;
                      if (iVar40 == 4) {
                        data_01[lVar53 + 3] = (uchar)uVar74;
                        uVar75 = (ulong)((int)uVar58 + 4);
                      }
                      local_8968 = local_8968 | uVar74;
                      iVar61 = iVar61 + 1;
                      uVar58 = uVar75 & 0xffffffff;
                    } while (iVar61 < (int)s->img_x);
                  }
                  stbi__skip(s,local_890c);
                  iVar61 = local_88c4 + 1;
                  sVar41 = s->img_y;
                  uVar58 = uVar75 & 0xffffffff;
                } while (iVar61 < (int)sVar41);
              }
              goto LAB_00135079;
            }
            local_890c = s->img_x * 2 & 2;
LAB_001349be:
            if ((z != 0 && uStack_88fc != 0) && (uint)local_88d0 != 0) {
              iVar68 = stbi__high_bit(uStack_88fc);
              local_88d8 = (stbi__uint16 *)CONCAT44(local_88d8._4_4_,iVar68);
              uVar43 = stbi__bitcount(uStack_88fc);
              iVar68 = stbi__high_bit(z);
              local_894c = stbi__bitcount(z);
              iVar64 = stbi__high_bit(uVar74);
              uVar74 = stbi__bitcount(uVar74);
              iVar57 = stbi__high_bit(z_00);
              uVar62 = stbi__bitcount(z_00);
              local_88c0 = (anon_struct_96_18_0d0905d3 *)CONCAT44(local_88c0._4_4_,uVar74);
              local_88b8 = CONCAT44(local_88b8._4_4_,uVar62);
              if ((uVar74 < 9 && (local_894c < 9 && uVar43 < 9)) && uVar62 < 9) {
                iVar61 = (int)local_88d8 + -7;
                iVar68 = iVar68 + -7;
                iVar64 = iVar64 + -7;
                iVar57 = iVar57 + -7;
                local_88c8 = (undefined4)CONCAT71((uint7)(uint3)(uVar62 >> 8),1);
                bVar78 = false;
                goto LAB_00134ac4;
              }
            }
            free(data_01);
            pcVar45 = "bad masks";
          }
        }
        else {
LAB_00133701:
          pcVar45 = "too large";
        }
      }
      else {
        if (s->read_from_callbacks != 0) {
          stbi__refill_buffer(s);
          psVar59 = s->img_buffer;
          goto LAB_001335ee;
        }
LAB_0013370d:
        s->img_buffer = s->img_buffer_original;
        s->img_buffer_end = s->img_buffer_original_end;
LAB_0013371f:
        iVar40 = stbi__gif_test(s);
        if (iVar40 != 0) {
          memset(&local_88a8,0,0x8870);
          psVar49 = (stbi__context *)stbi__gif_load_next(s,&local_88a8,comp,0,psVar56);
          if (psVar49 == (stbi__context *)0x0 || psVar49 == s) {
            if ((stbi__jpeg *)local_88a8.out != (stbi__jpeg *)0x0) {
              free(local_88a8.out);
            }
            psVar49 = (stbi__context *)0x0;
          }
          else {
            *x = local_88a8.w;
            *y = local_88a8.h;
            if ((req_comp & 0xfffffffbU) != 0) {
              psVar49 = (stbi__context *)
                        stbi__convert_format((uchar *)psVar49,4,req_comp,local_88a8.w,local_88a8.h);
            }
          }
          free(local_88a8.history);
          psVar44 = (stbi__jpeg *)local_88a8.background;
          goto LAB_00133c6f;
        }
        iVar40 = stbi__psd_test(s);
        if (iVar40 != 0) {
          pvVar47 = stbi__psd_load(s,x,y,comp,req_comp,ri,bpc);
          return pvVar47;
        }
        iVar40 = stbi__pic_test(s);
        if (iVar40 != 0) {
          pvVar47 = stbi__pic_load(s,x,y,comp,req_comp,ri_00);
          return pvVar47;
        }
        iVar40 = stbi__pnm_test(s);
        if (iVar40 != 0) {
          pvVar47 = stbi__pnm_load(s,x,y,comp,req_comp,ri_00);
          return pvVar47;
        }
        iVar40 = stbi__hdr_test(s);
        if (iVar40 != 0) {
          data_00 = stbi__hdr_load(s,x,y,comp,req_comp,ri_00);
          if (req_comp == 0) {
            req_comp = *comp;
          }
          psVar56 = stbi__hdr_to_ldr(data_00,*x,*y,req_comp);
          return psVar56;
        }
        iVar40 = stbi__tga_test(s);
        if (iVar40 != 0) {
          pvVar47 = stbi__tga_load(s,x,y,comp,req_comp,ri_00);
          return pvVar47;
        }
        pcVar45 = "unknown image type";
      }
LAB_00132241:
      *(char **)(in_FS_OFFSET + -0x10) = pcVar45;
    }
    else {
      if (4 < (uint)req_comp) {
        pcVar45 = "bad req_comp";
        goto LAB_00132241;
      }
      local_88a8._0_8_ = s;
      iVar40 = stbi__parse_png_file((stbi__png *)&local_88a8,0,req_comp);
      uVar7 = local_88a8._0_8_;
      if (iVar40 == 0) {
        psVar49 = (stbi__context *)0x0;
LAB_00133946:
        free(local_88a8.history);
        free(local_88a8.background);
        psVar44 = (stbi__jpeg *)local_88a8.out;
        goto LAB_00133c6f;
      }
      iVar40 = 8;
      if ((8 < local_88a8.flags) && (iVar40 = 0x10, local_88a8.flags != 0x10)) {
        pcVar45 = "bad bits_per_channel";
        goto LAB_00132241;
      }
      ri->bits_per_channel = iVar40;
      psVar49 = (stbi__context *)local_88a8.history;
      if ((req_comp == 0) || (iVar40 = *(int *)(local_88a8._0_8_ + 0xc), iVar40 == req_comp)) {
LAB_00133921:
        *x = *(stbi__uint32 *)uVar7;
        *y = *(stbi__uint32 *)(uVar7 + 4);
        if (comp != (int *)0x0) {
          *comp = *(int *)(uVar7 + 8);
        }
        local_88a8.history = (stbi_uc *)0x0;
        goto LAB_00133946;
      }
      if (local_88a8.flags < 9) {
        psVar49 = (stbi__context *)
                  stbi__convert_format
                            (local_88a8.history,iVar40,req_comp,*(stbi__uint32 *)local_88a8._0_8_,
                             *(stbi__uint32 *)(local_88a8._0_8_ + 4));
      }
      else {
        psVar49 = (stbi__context *)
                  stbi__convert_format16
                            ((stbi__uint16 *)local_88a8.history,iVar40,req_comp,
                             *(stbi__uint32 *)local_88a8._0_8_,
                             *(stbi__uint32 *)(local_88a8._0_8_ + 4));
      }
      *(int *)(uVar7 + 0xc) = req_comp;
      if (psVar49 != (stbi__context *)0x0) goto LAB_00133921;
    }
LAB_0013224a:
    psVar49 = (stbi__context *)0x0;
  }
  return psVar49;
LAB_001334fa:
  bVar78 = false;
  uVar58 = uVar75;
LAB_001334fc:
  if (!bVar78) goto LAB_00133c5a;
LAB_00133504:
  bVar39 = psVar44->marker;
LAB_0013350c:
  if (bVar39 != 0xff) goto LAB_0013234a;
LAB_00133514:
  do {
    psVar49 = psVar44->s;
    if ((psVar49->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00133534:
      if (psVar49->img_buffer_end <= psVar49->img_buffer) goto LAB_0013234a;
    }
    else {
      iVar40 = (*(psVar49->io).eof)(psVar49->io_user_data);
      if (iVar40 != 0) {
        if (psVar49->read_from_callbacks != 0) goto LAB_00133534;
        goto LAB_0013234a;
      }
    }
    psVar49 = psVar44->s;
    psVar56 = psVar49->img_buffer;
    if (psVar49->img_buffer_end <= psVar56) {
      if (psVar49->read_from_callbacks == 0) goto LAB_00133514;
      stbi__refill_buffer(psVar49);
      psVar56 = psVar49->img_buffer;
    }
    psVar49->img_buffer = psVar56 + 1;
  } while (*psVar56 != 0xff);
  psVar49 = psVar44->s;
  psVar56 = psVar49->img_buffer;
  if (psVar56 < psVar49->img_buffer_end) {
LAB_001335ac:
    psVar49->img_buffer = psVar56 + 1;
    sVar38 = *psVar56;
  }
  else {
    if (psVar49->read_from_callbacks != 0) {
      stbi__refill_buffer(psVar49);
      psVar56 = psVar49->img_buffer;
      goto LAB_001335ac;
    }
    sVar38 = '\0';
  }
  psVar44->marker = sVar38;
LAB_0013234a:
  bVar39 = stbi__get_marker(psVar44);
  goto LAB_001322f2;
LAB_0013490e:
  uVar58 = (ulong)(uVar43 - 0x10);
  psVar44->code_bits = uVar43 - 0x10;
LAB_00134919:
  pcVar45 = "bad huffman code";
LAB_00133c51:
  *(char **)(in_FS_OFFSET + -0x10) = pcVar45;
  goto LAB_00133c5a;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #else
   STBI_NOTUSED(bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}